

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-idna.c
# Opt level: O1

int run_test_utf8_decode1(void)

{
  char *****pppppcVar1;
  uint uVar2;
  int iVar3;
  int extraout_EAX;
  long lVar4;
  size_t sVar5;
  uv_loop_t *loop;
  char *loop_00;
  char *****pppppcVar6;
  char *****pppppcVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  char *p;
  char b [32];
  sockaddr_in sStack_2d8;
  char cStack_2c8;
  char cStack_2c7;
  char cStack_2c6;
  char cStack_2c5;
  char cStack_2c4;
  char cStack_2c3;
  char cStack_2c2;
  char cStack_2c1;
  char cStack_2c0;
  char cStack_2bf;
  char cStack_2be;
  char cStack_2bd;
  char cStack_2bc;
  char cStack_2bb;
  char cStack_2ba;
  char cStack_2b9;
  undefined1 *puStack_2b8;
  char acStack_2b0 [4];
  char cStack_2ac;
  char cStack_2ab;
  char cStack_2aa;
  char cStack_2a9;
  char cStack_2a8;
  char cStack_2a7;
  char cStack_2a6;
  char cStack_2a5;
  char cStack_2a4;
  char cStack_2a3;
  char cStack_2a2;
  char cStack_2a1;
  char cStack_2a0;
  char cStack_29f;
  char cStack_29e;
  char cStack_29d;
  char cStack_29c;
  char cStack_29b;
  char cStack_29a;
  char cStack_299;
  char cStack_298;
  char cStack_297;
  char cStack_296;
  char cStack_295;
  char cStack_294;
  char cStack_293;
  char cStack_292;
  char cStack_291;
  char cStack_1b0;
  char cStack_1af;
  char cStack_1ae;
  char cStack_1ad;
  char cStack_1ac;
  char cStack_1ab;
  char cStack_1aa;
  char cStack_1a9;
  char cStack_1a8;
  char cStack_1a7;
  char cStack_1a6;
  char cStack_1a5;
  char cStack_1a4;
  char cStack_1a3;
  char cStack_1a2;
  char cStack_1a1;
  char cStack_1a0;
  char cStack_19f;
  char cStack_19e;
  char cStack_19d;
  char cStack_19c;
  char cStack_19b;
  char cStack_19a;
  char cStack_199;
  char cStack_198;
  char cStack_197;
  char cStack_196;
  char cStack_195;
  char cStack_194;
  char cStack_193;
  char cStack_192;
  char cStack_191;
  char acStack_b0 [48];
  char *pcStack_80;
  char ****ppppcStack_78;
  char ****ppppcStack_70;
  char ****local_60;
  undefined1 local_58 [2];
  undefined1 auStack_56 [2];
  undefined1 auStack_54 [4];
  undefined1 local_50 [24];
  char local_38 [8];
  
  ppppcStack_70 = (char ****)0x15adb4;
  local_60 = (char ****)local_58;
  snprintf(local_58,0x20,"%c\x7f",0);
  ppppcStack_70 = (char ****)0x15adc4;
  uVar2 = uv__utf8_decode1((char **)&local_60,local_38);
  pppppcVar6 = (char *****)local_58;
  if (uVar2 == 0) {
    if (local_60 != (char ****)(local_58 + 1)) goto LAB_0015b091;
    ppppcStack_70 = (char ****)0x15ade9;
    uVar2 = uv__utf8_decode1((char **)&local_60,local_38);
    if (uVar2 != 0x7f) goto LAB_0015b096;
    pppppcVar7 = (char *****)(local_58 + 2);
    if ((char *****)local_60 != pppppcVar7) goto LAB_0015b09b;
    _local_58 = (char ****)CONCAT35(auStack_54._1_3_,0xbfdf80c2);
    ppppcStack_70 = (char ****)0x15ae1f;
    local_60 = (char ****)local_58;
    uVar2 = uv__utf8_decode1((char **)&local_60,local_38);
    if (uVar2 != 0x80) goto LAB_0015b0a0;
    if ((char *****)local_60 != pppppcVar7) goto LAB_0015b0a5;
    ppppcStack_70 = (char ****)0x15ae42;
    uVar2 = uv__utf8_decode1((char **)&local_60,local_38);
    if (uVar2 != 0x7ff) goto LAB_0015b0aa;
    pppppcVar1 = (char *****)(local_58 + 4);
    if ((char *****)local_60 != pppppcVar1) goto LAB_0015b0af;
    _local_58 = (char ****)CONCAT17(auStack_54[3],0xbfbfef80a0e0);
    ppppcStack_70 = (char ****)0x15ae7d;
    local_60 = (char ****)local_58;
    uVar2 = uv__utf8_decode1((char **)&local_60,local_38);
    if (uVar2 != 0x800) goto LAB_0015b0b4;
    if (local_60 != (char ****)(local_58 + 3)) goto LAB_0015b0b9;
    ppppcStack_70 = (char ****)0x15aea5;
    uVar2 = uv__utf8_decode1((char **)&local_60,local_38);
    if (uVar2 != 0xffff) goto LAB_0015b0be;
    if (local_60 != (char ****)(local_58 + 6)) goto LAB_0015b0c3;
    _local_58 = (char ****)0xbfbf8ff4808090f0;
    local_50[0] = 0;
    ppppcStack_70 = (char ****)0x15aee4;
    local_60 = (char ****)local_58;
    uVar2 = uv__utf8_decode1((char **)&local_60,local_38);
    if (uVar2 != 0x10000) goto LAB_0015b0c8;
    if ((char *****)local_60 != pppppcVar1) goto LAB_0015b0cd;
    ppppcStack_70 = (char ****)0x15af07;
    uVar2 = uv__utf8_decode1((char **)&local_60,local_38);
    if (uVar2 != 0x10ffff) goto LAB_0015b0d2;
    if (local_60 != (char ****)local_50) goto LAB_0015b0d7;
    _local_58 = (char ****)0xbfbfbff7c0c090f4;
    local_50[0] = 0;
    ppppcStack_70 = (char ****)0x15af46;
    local_60 = (char ****)local_58;
    uVar2 = uv__utf8_decode1((char **)&local_60,local_38);
    if (uVar2 != 0xffffffff) goto LAB_0015b0dc;
    if ((char *****)local_60 != pppppcVar1) goto LAB_0015b0e1;
    ppppcStack_70 = (char ****)0x15af67;
    uVar2 = uv__utf8_decode1((char **)&local_60,local_38);
    if (uVar2 != 0xffffffff) goto LAB_0015b0e6;
    if (local_60 != (char ****)local_50) goto LAB_0015b0eb;
    _local_58 = (char ****)CONCAT35(auStack_54._1_3_,0x80c180c0);
    ppppcStack_70 = (char ****)0x15af98;
    local_60 = (char ****)local_58;
    uVar2 = uv__utf8_decode1((char **)&local_60,local_38);
    if (uVar2 != 0xffffffff) goto LAB_0015b0f0;
    if ((char *****)local_60 != pppppcVar7) goto LAB_0015b0f5;
    ppppcStack_70 = (char ****)0x15afb9;
    uVar2 = uv__utf8_decode1((char **)&local_60,local_38);
    if (uVar2 != 0xffffffff) goto LAB_0015b0fa;
    if ((char *****)local_60 != pppppcVar1) goto LAB_0015b0ff;
    _local_58 = (char ****)CONCAT17(auStack_54[3],0xbfa3ed80a0ed);
    ppppcStack_70 = (char ****)0x15afed;
    local_60 = (char ****)local_58;
    uVar2 = uv__utf8_decode1((char **)&local_60,local_38);
    if (uVar2 != 0xffffffff) goto LAB_0015b104;
    if (local_60 != (char ****)(local_58 + 3)) goto LAB_0015b109;
    ppppcStack_70 = (char ****)0x15b013;
    uVar2 = uv__utf8_decode1((char **)&local_60,local_38);
    if (uVar2 != 0xffffffff) goto LAB_0015b10e;
    if (local_60 == (char ****)(local_58 + 6)) {
      _local_58 = (char ****)0xfffefdfcfbfaf9f8;
      local_50[0] = 0;
      pppppcVar6 = (char *****)0x1;
      local_60 = (char ****)local_58;
      while( true ) {
        ppppcStack_70 = (char ****)0x15b054;
        uVar2 = uv__utf8_decode1((char **)&local_60,local_38);
        if (uVar2 != 0xffffffff) break;
        if ((char ****)(local_58 + (long)pppppcVar6) != local_60) {
          ppppcStack_70 = (char ****)0x15b087;
          run_test_utf8_decode1_cold_30();
          break;
        }
        pppppcVar6 = (char *****)((long)pppppcVar6 + 1);
        if (pppppcVar6 == (char *****)0x9) {
          return 0;
        }
      }
      ppppcStack_70 = (char ****)0x15b08c;
      run_test_utf8_decode1_cold_29();
      goto LAB_0015b08c;
    }
  }
  else {
LAB_0015b08c:
    ppppcStack_70 = (char ****)0x15b091;
    run_test_utf8_decode1_cold_1();
LAB_0015b091:
    ppppcStack_70 = (char ****)0x15b096;
    run_test_utf8_decode1_cold_2();
LAB_0015b096:
    pppppcVar7 = &local_60;
    ppppcStack_70 = (char ****)0x15b09b;
    run_test_utf8_decode1_cold_3();
LAB_0015b09b:
    ppppcStack_70 = (char ****)0x15b0a0;
    run_test_utf8_decode1_cold_4();
LAB_0015b0a0:
    ppppcStack_70 = (char ****)0x15b0a5;
    run_test_utf8_decode1_cold_5();
LAB_0015b0a5:
    ppppcStack_70 = (char ****)0x15b0aa;
    run_test_utf8_decode1_cold_6();
LAB_0015b0aa:
    ppppcStack_70 = (char ****)0x15b0af;
    run_test_utf8_decode1_cold_7();
LAB_0015b0af:
    ppppcStack_70 = (char ****)0x15b0b4;
    run_test_utf8_decode1_cold_8();
LAB_0015b0b4:
    ppppcStack_70 = (char ****)0x15b0b9;
    run_test_utf8_decode1_cold_9();
LAB_0015b0b9:
    ppppcStack_70 = (char ****)0x15b0be;
    run_test_utf8_decode1_cold_10();
LAB_0015b0be:
    ppppcStack_70 = (char ****)0x15b0c3;
    run_test_utf8_decode1_cold_11();
LAB_0015b0c3:
    ppppcStack_70 = (char ****)0x15b0c8;
    run_test_utf8_decode1_cold_12();
LAB_0015b0c8:
    ppppcStack_70 = (char ****)0x15b0cd;
    run_test_utf8_decode1_cold_13();
LAB_0015b0cd:
    ppppcStack_70 = (char ****)0x15b0d2;
    run_test_utf8_decode1_cold_14();
LAB_0015b0d2:
    ppppcStack_70 = (char ****)0x15b0d7;
    run_test_utf8_decode1_cold_15();
LAB_0015b0d7:
    ppppcStack_70 = (char ****)0x15b0dc;
    run_test_utf8_decode1_cold_16();
LAB_0015b0dc:
    ppppcStack_70 = (char ****)0x15b0e1;
    run_test_utf8_decode1_cold_17();
LAB_0015b0e1:
    ppppcStack_70 = (char ****)0x15b0e6;
    run_test_utf8_decode1_cold_18();
LAB_0015b0e6:
    ppppcStack_70 = (char ****)0x15b0eb;
    run_test_utf8_decode1_cold_19();
LAB_0015b0eb:
    ppppcStack_70 = (char ****)0x15b0f0;
    run_test_utf8_decode1_cold_20();
LAB_0015b0f0:
    ppppcStack_70 = (char ****)0x15b0f5;
    run_test_utf8_decode1_cold_21();
LAB_0015b0f5:
    ppppcStack_70 = (char ****)0x15b0fa;
    run_test_utf8_decode1_cold_22();
LAB_0015b0fa:
    ppppcStack_70 = (char ****)0x15b0ff;
    run_test_utf8_decode1_cold_23();
LAB_0015b0ff:
    ppppcStack_70 = (char ****)0x15b104;
    run_test_utf8_decode1_cold_24();
LAB_0015b104:
    ppppcStack_70 = (char ****)0x15b109;
    run_test_utf8_decode1_cold_25();
LAB_0015b109:
    ppppcStack_70 = (char ****)0x15b10e;
    run_test_utf8_decode1_cold_26();
LAB_0015b10e:
    ppppcStack_70 = (char ****)0x15b113;
    run_test_utf8_decode1_cold_27();
  }
  ppppcStack_70 = (char ****)run_test_idna_toascii;
  run_test_utf8_decode1_cold_28();
  puStack_2b8 = (undefined1 *)0x15b136;
  pcStack_80 = local_38;
  ppppcStack_78 = (char ****)pppppcVar6;
  ppppcStack_70 = (char ****)pppppcVar7;
  memset(acStack_2b0,0,0x100);
  puStack_2b8 = (undefined1 *)0x15b154;
  lVar4 = uv__idna_toascii(anon_var_dwarf_3900b,anon_var_dwarf_3900b + 4,acStack_2b0,&cStack_1b0);
  if (lVar4 == -0x16) {
    puStack_2b8 = (undefined1 *)0x15b170;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15b18e;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_1,run_test_idna_toascii::s_1 + 8,acStack_2b0,
                             &cStack_1b0);
    if (lVar4 != -0x16) goto LAB_0015dfa2;
    puStack_2b8 = (undefined1 *)0x15b1aa;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15b1be;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15b1d8;
    lVar4 = uv__idna_toascii("","",acStack_2b0,&cStack_1b0);
    if (lVar4 != 1) goto LAB_0015dfa7;
    if (acStack_2b0[0] != '\0') goto LAB_0015dfac;
    puStack_2b8 = (undefined1 *)0x15b1f7;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15b213;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 1) goto LAB_0015dfb1;
    if (cStack_1b0 != '\0') goto LAB_0015dfb6;
    puStack_2b8 = (undefined1 *)0x15b240;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015dfbb;
    puStack_2b8 = (undefined1 *)0x15b25a;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15b26e;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15b28c;
    lVar4 = uv__idna_toascii(".","",acStack_2b0,&cStack_1b0);
    if (lVar4 != 2) goto LAB_0015dfc0;
    if (CONCAT11(acStack_2b0[1],acStack_2b0[0]) != 0x2e) goto LAB_0015dfc5;
    puStack_2b8 = (undefined1 *)0x15b2ac;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15b2c8;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 2) goto LAB_0015dfca;
    if (CONCAT11(cStack_1af,cStack_1b0) != 0x2e) goto LAB_0015dfcf;
    puStack_2b8 = (undefined1 *)0x15b2f6;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015dfd4;
    puStack_2b8 = (undefined1 *)0x15b310;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15b324;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15b342;
    lVar4 = uv__idna_toascii(".com","",acStack_2b0,&cStack_1b0);
    if (lVar4 != 5) goto LAB_0015dfd9;
    if (cStack_2ac != '\0' ||
        CONCAT13(acStack_2b0[3],CONCAT12(acStack_2b0[2],CONCAT11(acStack_2b0[1],acStack_2b0[0]))) !=
        0x6d6f632e) goto LAB_0015dfde;
    puStack_2b8 = (undefined1 *)0x15b36c;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15b388;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 5) goto LAB_0015dfe3;
    if (cStack_1ac != '\0' ||
        CONCAT13(cStack_1ad,CONCAT12(cStack_1ae,CONCAT11(cStack_1af,cStack_1b0))) != 0x6d6f632e)
    goto LAB_0015dfe8;
    puStack_2b8 = (undefined1 *)0x15b3c3;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015dfed;
    puStack_2b8 = (undefined1 *)0x15b3dd;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15b3f1;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15b40f;
    lVar4 = uv__idna_toascii("example","",acStack_2b0,&cStack_1b0);
    if (lVar4 != 8) goto LAB_0015dff2;
    if (CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x656c706d617865)
    goto LAB_0015dff7;
    puStack_2b8 = (undefined1 *)0x15b438;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15b454;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 8) goto LAB_0015dffc;
    if (CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x656c706d617865) goto LAB_0015e001;
    puStack_2b8 = (undefined1 *)0x15b481;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e006;
    puStack_2b8 = (undefined1 *)0x15b49b;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15b4af;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15b4cd;
    lVar4 = uv__idna_toascii("example-","",acStack_2b0,&cStack_1b0);
    if (lVar4 != 9) goto LAB_0015e00b;
    if (cStack_2a8 != '\0' ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x2d656c706d617865)
    goto LAB_0015e010;
    puStack_2b8 = (undefined1 *)0x15b501;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15b51d;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 9) goto LAB_0015e015;
    if (cStack_1a8 != '\0' ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x2d656c706d617865) goto LAB_0015e01a;
    puStack_2b8 = (undefined1 *)0x15b555;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e01f;
    puStack_2b8 = (undefined1 *)0x15b56f;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15b583;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15b5a1;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_7,run_test_idna_toascii::s_7 + 10,acStack_2b0,
                             &cStack_1b0);
    if (lVar4 != 0x11) goto LAB_0015e024;
    if ((cStack_2a0 != '\0' ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x617274732d2d6e78)
        || CONCAT17(cStack_2a1,
                    CONCAT16(cStack_2a2,
                             CONCAT15(cStack_2a3,
                                      CONCAT14(cStack_2a4,
                                               CONCAT13(cStack_2a5,
                                                        CONCAT12(cStack_2a6,
                                                                 CONCAT11(cStack_2a7,cStack_2a8)))))
                            )) != 0x65642e61716f2d65) goto LAB_0015e029;
    puStack_2b8 = (undefined1 *)0x15b5ea;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15b606;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x11) goto LAB_0015e02e;
    if ((cStack_1a0 != '\0' ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x617274732d2d6e78) ||
        CONCAT17(cStack_1a1,
                 CONCAT16(cStack_1a2,
                          CONCAT15(cStack_1a3,
                                   CONCAT14(cStack_1a4,
                                            CONCAT13(cStack_1a5,
                                                     CONCAT12(cStack_1a6,
                                                              CONCAT11(cStack_1a7,cStack_1a8)))))))
        != 0x65642e61716f2d65) goto LAB_0015e033;
    puStack_2b8 = (undefined1 *)0x15b649;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e038;
    puStack_2b8 = (undefined1 *)0x15b663;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15b677;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15b695;
    lVar4 = uv__idna_toascii("foo.bar","",acStack_2b0,&cStack_1b0);
    if (lVar4 != 8) goto LAB_0015e03d;
    if (CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x7261622e6f6f66)
    goto LAB_0015e042;
    puStack_2b8 = (undefined1 *)0x15b6be;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15b6da;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 8) goto LAB_0015e047;
    if (CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x7261622e6f6f66) goto LAB_0015e04c;
    puStack_2b8 = (undefined1 *)0x15b707;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e051;
    puStack_2b8 = (undefined1 *)0x15b721;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15b735;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15b753;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_9,run_test_idna_toascii::s_9 + 0xb,acStack_2b0
                             ,&cStack_1b0);
    if (lVar4 != 0x12) goto LAB_0015e056;
    auVar8[0] = -(acStack_2b0[0] == 'x');
    auVar8[1] = -(acStack_2b0[1] == 'n');
    auVar8[2] = -(acStack_2b0[2] == '-');
    auVar8[3] = -(acStack_2b0[3] == '-');
    auVar8[4] = -(cStack_2ac == 'm');
    auVar8[5] = -(cStack_2ab == 'a');
    auVar8[6] = -(cStack_2aa == 'a');
    auVar8[7] = -(cStack_2a9 == 'n');
    auVar8[8] = -(cStack_2a8 == 'a');
    auVar8[9] = -(cStack_2a7 == '-');
    auVar8[10] = -(cStack_2a6 == 'p');
    auVar8[0xb] = -(cStack_2a5 == 't');
    auVar8[0xc] = -(cStack_2a4 == 'a');
    auVar8[0xd] = -(cStack_2a3 == '.');
    auVar8[0xe] = -(cStack_2a2 == 'c');
    auVar8[0xf] = -(cStack_2a1 == 'o');
    auVar46[0] = -(cStack_2a0 == 'm');
    auVar46[1] = -(cStack_29f == '\0');
    auVar46[2] = 0xff;
    auVar46[3] = 0xff;
    auVar46[4] = 0xff;
    auVar46[5] = 0xff;
    auVar46[6] = 0xff;
    auVar46[7] = 0xff;
    auVar46[8] = 0xff;
    auVar46[9] = 0xff;
    auVar46[10] = 0xff;
    auVar46[0xb] = 0xff;
    auVar46[0xc] = 0xff;
    auVar46[0xd] = 0xff;
    auVar46[0xe] = 0xff;
    auVar46[0xf] = 0xff;
    auVar46 = auVar46 & auVar8;
    if ((ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) | (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar46[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e05b;
    puStack_2b8 = (undefined1 *)0x15b799;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15b7b5;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x12) goto LAB_0015e060;
    auVar9[0] = -(cStack_1a0 == 'm');
    auVar9[1] = -(cStack_19f == '\0');
    auVar9[2] = 0xff;
    auVar9[3] = 0xff;
    auVar9[4] = 0xff;
    auVar9[5] = 0xff;
    auVar9[6] = 0xff;
    auVar9[7] = 0xff;
    auVar9[8] = 0xff;
    auVar9[9] = 0xff;
    auVar9[10] = 0xff;
    auVar9[0xb] = 0xff;
    auVar9[0xc] = 0xff;
    auVar9[0xd] = 0xff;
    auVar9[0xe] = 0xff;
    auVar9[0xf] = 0xff;
    builtin_strncpy(acStack_b0,"xn--maana-pta.co",0x10);
    auVar47[0] = -(cStack_1b0 == 'x');
    auVar47[1] = -(cStack_1af == 'n');
    auVar47[2] = -(cStack_1ae == '-');
    auVar47[3] = -(cStack_1ad == '-');
    auVar47[4] = -(cStack_1ac == 'm');
    auVar47[5] = -(cStack_1ab == 'a');
    auVar47[6] = -(cStack_1aa == 'a');
    auVar47[7] = -(cStack_1a9 == 'n');
    auVar47[8] = -(cStack_1a8 == 'a');
    auVar47[9] = -(cStack_1a7 == '-');
    auVar47[10] = -(cStack_1a6 == 'p');
    auVar47[0xb] = -(cStack_1a5 == 't');
    auVar47[0xc] = -(cStack_1a4 == 'a');
    auVar47[0xd] = -(cStack_1a3 == '.');
    auVar47[0xe] = -(cStack_1a2 == 'c');
    auVar47[0xf] = -(cStack_1a1 == 'o');
    auVar9 = auVar9 & auVar47;
    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e065;
    puStack_2b8 = (undefined1 *)0x15b833;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e06a;
    puStack_2b8 = (undefined1 *)0x15b84d;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15b861;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15b87f;
    lVar4 = uv__idna_toascii("example.com.","",acStack_2b0,&cStack_1b0);
    if (lVar4 != 0xd) goto LAB_0015e06f;
    if (CONCAT17(cStack_2a4,
                 CONCAT16(cStack_2a5,
                          CONCAT15(cStack_2a6,
                                   CONCAT14(cStack_2a7,
                                            CONCAT13(cStack_2a8,
                                                     CONCAT12(cStack_2a9,
                                                              CONCAT11(cStack_2aa,cStack_2ab)))))))
        != 0x2e6d6f632e656c ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x2e656c706d617865)
    goto LAB_0015e074;
    puStack_2b8 = (undefined1 *)0x15b8c0;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15b8dc;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0xd) goto LAB_0015e079;
    if (CONCAT17(cStack_1a4,
                 CONCAT16(cStack_1a5,
                          CONCAT15(cStack_1a6,
                                   CONCAT14(cStack_1a7,
                                            CONCAT13(cStack_1a8,
                                                     CONCAT12(cStack_1a9,
                                                              CONCAT11(cStack_1aa,cStack_1ab)))))))
        != 0x2e6d6f632e656c ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x2e656c706d617865) goto LAB_0015e07e;
    puStack_2b8 = (undefined1 *)0x15b914;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e083;
    puStack_2b8 = (undefined1 *)0x15b92e;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15b942;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15b960;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_11,run_test_idna_toascii::s_11 + 0xb,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x12) goto LAB_0015e088;
    auVar10[0] = -(acStack_2b0[0] == 'x');
    auVar10[1] = -(acStack_2b0[1] == 'n');
    auVar10[2] = -(acStack_2b0[2] == '-');
    auVar10[3] = -(acStack_2b0[3] == '-');
    auVar10[4] = -(cStack_2ac == 'b');
    auVar10[5] = -(cStack_2ab == 'c');
    auVar10[6] = -(cStack_2aa == 'h');
    auVar10[7] = -(cStack_2a9 == 'e');
    auVar10[8] = -(cStack_2a8 == 'r');
    auVar10[9] = -(cStack_2a7 == '-');
    auVar10[10] = -(cStack_2a6 == 'k');
    auVar10[0xb] = -(cStack_2a5 == 'v');
    auVar10[0xc] = -(cStack_2a4 == 'a');
    auVar10[0xd] = -(cStack_2a3 == '.');
    auVar10[0xe] = -(cStack_2a2 == 'c');
    auVar10[0xf] = -(cStack_2a1 == 'o');
    auVar48[0] = -(cStack_2a0 == 'm');
    auVar48[1] = -(cStack_29f == '\0');
    auVar48[2] = 0xff;
    auVar48[3] = 0xff;
    auVar48[4] = 0xff;
    auVar48[5] = 0xff;
    auVar48[6] = 0xff;
    auVar48[7] = 0xff;
    auVar48[8] = 0xff;
    auVar48[9] = 0xff;
    auVar48[10] = 0xff;
    auVar48[0xb] = 0xff;
    auVar48[0xc] = 0xff;
    auVar48[0xd] = 0xff;
    auVar48[0xe] = 0xff;
    auVar48[0xf] = 0xff;
    auVar48 = auVar48 & auVar10;
    if ((ushort)((ushort)(SUB161(auVar48 >> 7,0) & 1) | (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar48 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar48[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e08d;
    puStack_2b8 = (undefined1 *)0x15b9a6;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15b9c2;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x12) goto LAB_0015e092;
    auVar11[0] = -(cStack_1b0 == 'x');
    auVar11[1] = -(cStack_1af == 'n');
    auVar11[2] = -(cStack_1ae == '-');
    auVar11[3] = -(cStack_1ad == '-');
    auVar11[4] = -(cStack_1ac == 'b');
    auVar11[5] = -(cStack_1ab == 'c');
    auVar11[6] = -(cStack_1aa == 'h');
    auVar11[7] = -(cStack_1a9 == 'e');
    auVar11[8] = -(cStack_1a8 == 'r');
    auVar11[9] = -(cStack_1a7 == '-');
    auVar11[10] = -(cStack_1a6 == 'k');
    auVar11[0xb] = -(cStack_1a5 == 'v');
    auVar11[0xc] = -(cStack_1a4 == 'a');
    auVar11[0xd] = -(cStack_1a3 == '.');
    auVar11[0xe] = -(cStack_1a2 == 'c');
    auVar11[0xf] = -(cStack_1a1 == 'o');
    auVar49[0] = -(cStack_1a0 == 'm');
    auVar49[1] = -(cStack_19f == '\0');
    auVar49[2] = 0xff;
    auVar49[3] = 0xff;
    auVar49[4] = 0xff;
    auVar49[5] = 0xff;
    auVar49[6] = 0xff;
    auVar49[7] = 0xff;
    auVar49[8] = 0xff;
    auVar49[9] = 0xff;
    auVar49[10] = 0xff;
    auVar49[0xb] = 0xff;
    auVar49[0xc] = 0xff;
    auVar49[0xd] = 0xff;
    auVar49[0xe] = 0xff;
    auVar49[0xf] = 0xff;
    auVar49 = auVar49 & auVar11;
    if ((ushort)((ushort)(SUB161(auVar49 >> 7,0) & 1) | (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar49[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e097;
    puStack_2b8 = (undefined1 *)0x15ba33;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e09c;
    puStack_2b8 = (undefined1 *)0x15ba4d;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15ba61;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15ba7f;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_12,run_test_idna_toascii::s_12 + 9,acStack_2b0
                             ,&cStack_1b0);
    if (lVar4 != 0x10) goto LAB_0015e0a1;
    auVar12[0] = -(acStack_2b0[0] == 'x');
    auVar12[1] = -(acStack_2b0[1] == 'n');
    auVar12[2] = -(acStack_2b0[2] == '-');
    auVar12[3] = -(acStack_2b0[3] == '-');
    auVar12[4] = -(cStack_2ac == 'c');
    auVar12[5] = -(cStack_2ab == 'a');
    auVar12[6] = -(cStack_2aa == 'f');
    auVar12[7] = -(cStack_2a9 == '-');
    auVar12[8] = -(cStack_2a8 == 'd');
    auVar12[9] = -(cStack_2a7 == 'm');
    auVar12[10] = -(cStack_2a6 == 'a');
    auVar12[0xb] = -(cStack_2a5 == '.');
    auVar12[0xc] = -(cStack_2a4 == 'c');
    auVar12[0xd] = -(cStack_2a3 == 'o');
    auVar12[0xe] = -(cStack_2a2 == 'm');
    auVar12[0xf] = -(cStack_2a1 == '\0');
    if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe | (ushort)(auVar12[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_0015e0a6;
    puStack_2b8 = (undefined1 *)0x15bab0;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15bacc;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x10) goto LAB_0015e0ab;
    if (CONCAT17(cStack_1a1,
                 CONCAT16(cStack_1a2,
                          CONCAT15(cStack_1a3,
                                   CONCAT14(cStack_1a4,
                                            CONCAT13(cStack_1a5,
                                                     CONCAT12(cStack_1a6,
                                                              CONCAT11(cStack_1a7,cStack_1a8)))))))
        != 0x6d6f632e616d64 ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x2d6661632d2d6e78) goto LAB_0015e0b0;
    puStack_2b8 = (undefined1 *)0x15bb1e;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e0b5;
    puStack_2b8 = (undefined1 *)0x15bb38;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15bb4c;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15bb6a;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_13,run_test_idna_toascii::s_13 + 0xf,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x1c) goto LAB_0015e0ba;
    builtin_strncpy(acStack_b0 + 0x20,"xn--caf-",9);
    acStack_b0[0x29] = '\0';
    acStack_b0[0x2a] = '\0';
    acStack_b0[0x2b] = '\0';
    acStack_b0[0x2c] = '\0';
    acStack_b0[0x2d] = '\0';
    acStack_b0[0x2e] = '\0';
    acStack_b0[0x2f] = '\0';
    auVar13[0] = -(acStack_2b0[0] == 'x');
    auVar13[1] = -(acStack_2b0[1] == 'n');
    auVar13[2] = -(acStack_2b0[2] == '-');
    auVar13[3] = -(acStack_2b0[3] == '-');
    auVar13[4] = -(cStack_2ac == 'c');
    auVar13[5] = -(cStack_2ab == 'a');
    auVar13[6] = -(cStack_2aa == 'f');
    auVar13[7] = -(cStack_2a9 == '-');
    auVar13[8] = -(cStack_2a8 == 'd');
    auVar13[9] = -(cStack_2a7 == 'm');
    auVar13[10] = -(cStack_2a6 == 'a');
    auVar13[0xb] = -(cStack_2a5 == '.');
    auVar13[0xc] = -(cStack_2a4 == 'x');
    auVar13[0xd] = -(cStack_2a3 == 'n');
    auVar13[0xe] = -(cStack_2a2 == '-');
    auVar13[0xf] = -(cStack_2a1 == '-');
    builtin_strncpy(acStack_b0 + 0x10,"xn--caf-dma.com",0x10);
    auVar50[0] = -(cStack_2a4 == 'x');
    auVar50[1] = -(cStack_2a3 == 'n');
    auVar50[2] = -(cStack_2a2 == '-');
    auVar50[3] = -(cStack_2a1 == '-');
    auVar50[4] = -(cStack_2a0 == 'c');
    auVar50[5] = -(cStack_29f == 'a');
    auVar50[6] = -(cStack_29e == 'f');
    auVar50[7] = -(cStack_29d == '-');
    auVar50[8] = -(cStack_29c == 'd');
    auVar50[9] = -(cStack_29b == 'm');
    auVar50[10] = -(cStack_29a == 'a');
    auVar50[0xb] = -(cStack_299 == '.');
    auVar50[0xc] = -(cStack_298 == 'c');
    auVar50[0xd] = -(cStack_297 == 'o');
    auVar50[0xe] = -(cStack_296 == 'm');
    auVar50[0xf] = -(cStack_295 == '\0');
    auVar13 = auVar13 & auVar50;
    if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e0bf;
    puStack_2b8 = (undefined1 *)0x15bbc9;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15bbe5;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x1c) goto LAB_0015e0c4;
    auVar51[0] = -(acStack_b0[0x20] == cStack_1b0);
    auVar51[1] = -(acStack_b0[0x21] == cStack_1af);
    auVar51[2] = -(acStack_b0[0x22] == cStack_1ae);
    auVar51[3] = -(acStack_b0[0x23] == cStack_1ad);
    auVar51[4] = -(acStack_b0[0x24] == cStack_1ac);
    auVar51[5] = -(acStack_b0[0x25] == cStack_1ab);
    auVar51[6] = -(acStack_b0[0x26] == cStack_1aa);
    auVar51[7] = -(acStack_b0[0x27] == cStack_1a9);
    auVar51[8] = -(cStack_1a8 == 'd');
    auVar51[9] = -(cStack_1a7 == 'm');
    auVar51[10] = -(cStack_1a6 == 'a');
    auVar51[0xb] = -(cStack_1a5 == '.');
    auVar51[0xc] = -(cStack_1a4 == 'x');
    auVar51[0xd] = -(cStack_1a3 == 'n');
    auVar51[0xe] = -(cStack_1a2 == '-');
    auVar51[0xf] = -(cStack_1a1 == '-');
    auVar14[0] = -(cStack_1a4 == acStack_b0[0x10]);
    auVar14[1] = -(cStack_1a3 == acStack_b0[0x11]);
    auVar14[2] = -(cStack_1a2 == acStack_b0[0x12]);
    auVar14[3] = -(cStack_1a1 == acStack_b0[0x13]);
    auVar14[4] = -(cStack_1a0 == acStack_b0[0x14]);
    auVar14[5] = -(cStack_19f == acStack_b0[0x15]);
    auVar14[6] = -(cStack_19e == acStack_b0[0x16]);
    auVar14[7] = -(cStack_19d == acStack_b0[0x17]);
    auVar14[8] = -(cStack_19c == acStack_b0[0x18]);
    auVar14[9] = -(cStack_19b == acStack_b0[0x19]);
    auVar14[10] = -(cStack_19a == acStack_b0[0x1a]);
    auVar14[0xb] = -(cStack_199 == acStack_b0[0x1b]);
    auVar14[0xc] = -(cStack_198 == acStack_b0[0x1c]);
    auVar14[0xd] = -(cStack_197 == acStack_b0[0x1d]);
    auVar14[0xe] = -(cStack_196 == acStack_b0[0x1e]);
    auVar14[0xf] = -(cStack_195 == acStack_b0[0x1f]);
    auVar51 = auVar51 & auVar14;
    if ((ushort)((ushort)(SUB161(auVar51 >> 7,0) & 1) | (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar51[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e0c9;
    puStack_2b8 = (undefined1 *)0x15bc4e;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e0ce;
    puStack_2b8 = (undefined1 *)0x15bc68;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15bc7c;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15bc9a;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_14,run_test_idna_toascii::s_14 + 0xb,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x11) goto LAB_0015e0d3;
    if ((cStack_2a0 != '\0' ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x71642d2d2d2d6e78)
        || CONCAT17(cStack_2a1,
                    CONCAT16(cStack_2a2,
                             CONCAT15(cStack_2a3,
                                      CONCAT14(cStack_2a4,
                                               CONCAT13(cStack_2a5,
                                                        CONCAT12(cStack_2a6,
                                                                 CONCAT11(cStack_2a7,cStack_2a8)))))
                            )) != 0x6d6f632e6b34336f) goto LAB_0015e0d8;
    puStack_2b8 = (undefined1 *)0x15bce3;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15bcff;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x11) goto LAB_0015e0dd;
    if ((cStack_1a0 != '\0' ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x71642d2d2d2d6e78) ||
        CONCAT17(cStack_1a1,
                 CONCAT16(cStack_1a2,
                          CONCAT15(cStack_1a3,
                                   CONCAT14(cStack_1a4,
                                            CONCAT13(cStack_1a5,
                                                     CONCAT12(cStack_1a6,
                                                              CONCAT11(cStack_1a7,cStack_1a8)))))))
        != 0x6d6f632e6b34336f) goto LAB_0015e0e2;
    puStack_2b8 = (undefined1 *)0x15bd45;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e0e7;
    puStack_2b8 = (undefined1 *)0x15bd5f;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15bd73;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15bd91;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_15,run_test_idna_toascii::s_15 + 0xe,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x15) goto LAB_0015e0ec;
    auVar52[0] = -(cStack_2ab == '-');
    auVar52[1] = -(cStack_2aa == 'd');
    auVar52[2] = -(cStack_2a9 == 'q');
    auVar52[3] = -(cStack_2a8 == 'o');
    auVar52[4] = -(cStack_2a7 == '3');
    auVar52[5] = -(cStack_2a6 == '4');
    auVar52[6] = -(cStack_2a5 == 'k');
    auVar52[7] = -(cStack_2a4 == 'n');
    auVar52[8] = -(cStack_2a3 == '6');
    auVar52[9] = -(cStack_2a2 == '5');
    auVar52[10] = -(cStack_2a1 == 'z');
    auVar52[0xb] = -(cStack_2a0 == '.');
    auVar52[0xc] = -(cStack_29f == 'c');
    auVar52[0xd] = -(cStack_29e == 'o');
    auVar52[0xe] = -(cStack_29d == 'm');
    auVar52[0xf] = -(cStack_29c == '\0');
    auVar15[0] = -(acStack_2b0[0] == 'x');
    auVar15[1] = -(acStack_2b0[1] == 'n');
    auVar15[2] = -(acStack_2b0[2] == '-');
    auVar15[3] = -(acStack_2b0[3] == '-');
    auVar15[4] = -(cStack_2ac == '-');
    auVar15[5] = -(cStack_2ab == '-');
    auVar15[6] = -(cStack_2aa == 'd');
    auVar15[7] = -(cStack_2a9 == 'q');
    auVar15[8] = -(cStack_2a8 == 'o');
    auVar15[9] = -(cStack_2a7 == '3');
    auVar15[10] = -(cStack_2a6 == '4');
    auVar15[0xb] = -(cStack_2a5 == 'k');
    auVar15[0xc] = -(cStack_2a4 == 'n');
    auVar15[0xd] = -(cStack_2a3 == '6');
    auVar15[0xe] = -(cStack_2a2 == '5');
    auVar15[0xf] = -(cStack_2a1 == 'z');
    auVar15 = auVar15 & auVar52;
    if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e0f1;
    puStack_2b8 = (undefined1 *)0x15bdd4;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15bdf0;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x15) goto LAB_0015e0f6;
    auVar16[0] = -(cStack_1b0 == 'x');
    auVar16[1] = -(cStack_1af == 'n');
    auVar16[2] = -(cStack_1ae == '-');
    auVar16[3] = -(cStack_1ad == '-');
    auVar16[4] = -(cStack_1ac == '-');
    auVar16[5] = -(cStack_1ab == '-');
    auVar16[6] = -(cStack_1aa == 'd');
    auVar16[7] = -(cStack_1a9 == 'q');
    auVar16[8] = -(cStack_1a8 == 'o');
    auVar16[9] = -(cStack_1a7 == '3');
    auVar16[10] = -(cStack_1a6 == '4');
    auVar16[0xb] = -(cStack_1a5 == 'k');
    auVar16[0xc] = -(cStack_1a4 == 'n');
    auVar16[0xd] = -(cStack_1a3 == '6');
    auVar16[0xe] = -(cStack_1a2 == '5');
    auVar16[0xf] = -(cStack_1a1 == 'z');
    auVar75[0] = -(cStack_1ab == '-');
    auVar75[1] = -(cStack_1aa == 'd');
    auVar75[2] = -(cStack_1a9 == 'q');
    auVar75[3] = -(cStack_1a8 == 'o');
    auVar75[4] = -(cStack_1a7 == '3');
    auVar75[5] = -(cStack_1a6 == '4');
    auVar75[6] = -(cStack_1a5 == 'k');
    auVar75[7] = -(cStack_1a4 == 'n');
    auVar75[8] = -(cStack_1a3 == '6');
    auVar75[9] = -(cStack_1a2 == '5');
    auVar75[10] = -(cStack_1a1 == 'z');
    auVar75[0xb] = -(cStack_1a0 == '.');
    auVar75[0xc] = -(cStack_19f == 'c');
    auVar75[0xd] = -(cStack_19e == 'o');
    auVar75[0xe] = -(cStack_19d == 'm');
    auVar75[0xf] = -(cStack_19c == '\0');
    auVar16 = auVar16 & auVar75;
    if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e0fb;
    puStack_2b8 = (undefined1 *)0x15be72;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e100;
    puStack_2b8 = (undefined1 *)0x15be8c;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15bea0;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15bebe;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_16,run_test_idna_toascii::s_16 + 7,acStack_2b0
                             ,&cStack_1b0);
    if (lVar4 != 0xc) goto LAB_0015e105;
    if (CONCAT13(cStack_2a5,CONCAT12(cStack_2a6,CONCAT11(cStack_2a7,cStack_2a8))) != 0x616c2e ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x6838736c2d2d6e78)
    goto LAB_0015e10a;
    puStack_2b8 = (undefined1 *)0x15bef8;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15bf14;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0xc) goto LAB_0015e10f;
    if (CONCAT13(cStack_1a5,CONCAT12(cStack_1a6,CONCAT11(cStack_1a7,cStack_1a8))) != 0x616c2e ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x6838736c2d2d6e78) goto LAB_0015e114;
    puStack_2b8 = (undefined1 *)0x15bf51;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e119;
    puStack_2b8 = (undefined1 *)0x15bf6b;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15bf7f;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15bf9d;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_17,run_test_idna_toascii::s_17 + 0xb,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x12) goto LAB_0015e11e;
    auVar17[0] = -(cStack_2a0 == 'm');
    auVar17[1] = -(cStack_29f == '\0');
    auVar17[2] = 0xff;
    auVar17[3] = 0xff;
    auVar17[4] = 0xff;
    auVar17[5] = 0xff;
    auVar17[6] = 0xff;
    auVar17[7] = 0xff;
    auVar17[8] = 0xff;
    auVar17[9] = 0xff;
    auVar17[10] = 0xff;
    auVar17[0xb] = 0xff;
    auVar17[0xc] = 0xff;
    auVar17[0xd] = 0xff;
    auVar17[0xe] = 0xff;
    auVar17[0xf] = 0xff;
    auVar53[0] = -(acStack_2b0[0] == acStack_b0[0]);
    auVar53[1] = -(acStack_2b0[1] == acStack_b0[1]);
    auVar53[2] = -(acStack_2b0[2] == acStack_b0[2]);
    auVar53[3] = -(acStack_2b0[3] == acStack_b0[3]);
    auVar53[4] = -(cStack_2ac == acStack_b0[4]);
    auVar53[5] = -(cStack_2ab == acStack_b0[5]);
    auVar53[6] = -(cStack_2aa == acStack_b0[6]);
    auVar53[7] = -(cStack_2a9 == acStack_b0[7]);
    auVar53[8] = -(cStack_2a8 == acStack_b0[8]);
    auVar53[9] = -(cStack_2a7 == acStack_b0[9]);
    auVar53[10] = -(cStack_2a6 == acStack_b0[10]);
    auVar53[0xb] = -(cStack_2a5 == acStack_b0[0xb]);
    auVar53[0xc] = -(cStack_2a4 == acStack_b0[0xc]);
    auVar53[0xd] = -(cStack_2a3 == acStack_b0[0xd]);
    auVar53[0xe] = -(cStack_2a2 == acStack_b0[0xe]);
    auVar53[0xf] = -(cStack_2a1 == acStack_b0[0xf]);
    auVar17 = auVar17 & auVar53;
    if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e123;
    puStack_2b8 = (undefined1 *)0x15bfe4;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15c000;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x12) goto LAB_0015e128;
    auVar18[0] = -(cStack_1a0 == 'm');
    auVar18[1] = -(cStack_19f == '\0');
    auVar18[2] = 0xff;
    auVar18[3] = 0xff;
    auVar18[4] = 0xff;
    auVar18[5] = 0xff;
    auVar18[6] = 0xff;
    auVar18[7] = 0xff;
    auVar18[8] = 0xff;
    auVar18[9] = 0xff;
    auVar18[10] = 0xff;
    auVar18[0xb] = 0xff;
    auVar18[0xc] = 0xff;
    auVar18[0xd] = 0xff;
    auVar18[0xe] = 0xff;
    auVar18[0xf] = 0xff;
    auVar54[0] = -(cStack_1b0 == acStack_b0[0]);
    auVar54[1] = -(cStack_1af == acStack_b0[1]);
    auVar54[2] = -(cStack_1ae == acStack_b0[2]);
    auVar54[3] = -(cStack_1ad == acStack_b0[3]);
    auVar54[4] = -(cStack_1ac == acStack_b0[4]);
    auVar54[5] = -(cStack_1ab == acStack_b0[5]);
    auVar54[6] = -(cStack_1aa == acStack_b0[6]);
    auVar54[7] = -(cStack_1a9 == acStack_b0[7]);
    auVar54[8] = -(cStack_1a8 == acStack_b0[8]);
    auVar54[9] = -(cStack_1a7 == acStack_b0[9]);
    auVar54[10] = -(cStack_1a6 == acStack_b0[10]);
    auVar54[0xb] = -(cStack_1a5 == acStack_b0[0xb]);
    auVar54[0xc] = -(cStack_1a4 == acStack_b0[0xc]);
    auVar54[0xd] = -(cStack_1a3 == acStack_b0[0xd]);
    auVar54[0xe] = -(cStack_1a2 == acStack_b0[0xe]);
    auVar54[0xf] = -(cStack_1a1 == acStack_b0[0xf]);
    auVar18 = auVar18 & auVar54;
    if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e12d;
    puStack_2b8 = (undefined1 *)0x15c058;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e132;
    puStack_2b8 = (undefined1 *)0x15c072;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15c086;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15c0a4;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_18,run_test_idna_toascii::s_18 + 0xd,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x12) goto LAB_0015e137;
    auVar19[0] = -(cStack_2a0 == 'm');
    auVar19[1] = -(cStack_29f == '\0');
    auVar19[2] = 0xff;
    auVar19[3] = 0xff;
    auVar19[4] = 0xff;
    auVar19[5] = 0xff;
    auVar19[6] = 0xff;
    auVar19[7] = 0xff;
    auVar19[8] = 0xff;
    auVar19[9] = 0xff;
    auVar19[10] = 0xff;
    auVar19[0xb] = 0xff;
    auVar19[0xc] = 0xff;
    auVar19[0xd] = 0xff;
    auVar19[0xe] = 0xff;
    auVar19[0xf] = 0xff;
    auVar55[0] = -(acStack_2b0[0] == acStack_b0[0]);
    auVar55[1] = -(acStack_2b0[1] == acStack_b0[1]);
    auVar55[2] = -(acStack_2b0[2] == acStack_b0[2]);
    auVar55[3] = -(acStack_2b0[3] == acStack_b0[3]);
    auVar55[4] = -(cStack_2ac == acStack_b0[4]);
    auVar55[5] = -(cStack_2ab == acStack_b0[5]);
    auVar55[6] = -(cStack_2aa == acStack_b0[6]);
    auVar55[7] = -(cStack_2a9 == acStack_b0[7]);
    auVar55[8] = -(cStack_2a8 == acStack_b0[8]);
    auVar55[9] = -(cStack_2a7 == acStack_b0[9]);
    auVar55[10] = -(cStack_2a6 == acStack_b0[10]);
    auVar55[0xb] = -(cStack_2a5 == acStack_b0[0xb]);
    auVar55[0xc] = -(cStack_2a4 == acStack_b0[0xc]);
    auVar55[0xd] = -(cStack_2a3 == acStack_b0[0xd]);
    auVar55[0xe] = -(cStack_2a2 == acStack_b0[0xe]);
    auVar55[0xf] = -(cStack_2a1 == acStack_b0[0xf]);
    auVar19 = auVar19 & auVar55;
    if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e13c;
    puStack_2b8 = (undefined1 *)0x15c0eb;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15c107;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x12) goto LAB_0015e141;
    auVar20[0] = -(cStack_1a0 == 'm');
    auVar20[1] = -(cStack_19f == '\0');
    auVar20[2] = 0xff;
    auVar20[3] = 0xff;
    auVar20[4] = 0xff;
    auVar20[5] = 0xff;
    auVar20[6] = 0xff;
    auVar20[7] = 0xff;
    auVar20[8] = 0xff;
    auVar20[9] = 0xff;
    auVar20[10] = 0xff;
    auVar20[0xb] = 0xff;
    auVar20[0xc] = 0xff;
    auVar20[0xd] = 0xff;
    auVar20[0xe] = 0xff;
    auVar20[0xf] = 0xff;
    auVar56[0] = -(cStack_1b0 == acStack_b0[0]);
    auVar56[1] = -(cStack_1af == acStack_b0[1]);
    auVar56[2] = -(cStack_1ae == acStack_b0[2]);
    auVar56[3] = -(cStack_1ad == acStack_b0[3]);
    auVar56[4] = -(cStack_1ac == acStack_b0[4]);
    auVar56[5] = -(cStack_1ab == acStack_b0[5]);
    auVar56[6] = -(cStack_1aa == acStack_b0[6]);
    auVar56[7] = -(cStack_1a9 == acStack_b0[7]);
    auVar56[8] = -(cStack_1a8 == acStack_b0[8]);
    auVar56[9] = -(cStack_1a7 == acStack_b0[9]);
    auVar56[10] = -(cStack_1a6 == acStack_b0[10]);
    auVar56[0xb] = -(cStack_1a5 == acStack_b0[0xb]);
    auVar56[0xc] = -(cStack_1a4 == acStack_b0[0xc]);
    auVar56[0xd] = -(cStack_1a3 == acStack_b0[0xd]);
    auVar56[0xe] = -(cStack_1a2 == acStack_b0[0xe]);
    auVar56[0xf] = -(cStack_1a1 == acStack_b0[0xf]);
    auVar20 = auVar20 & auVar56;
    if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e146;
    puStack_2b8 = (undefined1 *)0x15c15f;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e14b;
    puStack_2b8 = (undefined1 *)0x15c179;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15c18d;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15c1ab;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_19,run_test_idna_toascii::s_19 + 0xd,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x12) goto LAB_0015e150;
    auVar21[0] = -(cStack_2a0 == 'm');
    auVar21[1] = -(cStack_29f == '\0');
    auVar21[2] = 0xff;
    auVar21[3] = 0xff;
    auVar21[4] = 0xff;
    auVar21[5] = 0xff;
    auVar21[6] = 0xff;
    auVar21[7] = 0xff;
    auVar21[8] = 0xff;
    auVar21[9] = 0xff;
    auVar21[10] = 0xff;
    auVar21[0xb] = 0xff;
    auVar21[0xc] = 0xff;
    auVar21[0xd] = 0xff;
    auVar21[0xe] = 0xff;
    auVar21[0xf] = 0xff;
    auVar57[0] = -(acStack_2b0[0] == acStack_b0[0]);
    auVar57[1] = -(acStack_2b0[1] == acStack_b0[1]);
    auVar57[2] = -(acStack_2b0[2] == acStack_b0[2]);
    auVar57[3] = -(acStack_2b0[3] == acStack_b0[3]);
    auVar57[4] = -(cStack_2ac == acStack_b0[4]);
    auVar57[5] = -(cStack_2ab == acStack_b0[5]);
    auVar57[6] = -(cStack_2aa == acStack_b0[6]);
    auVar57[7] = -(cStack_2a9 == acStack_b0[7]);
    auVar57[8] = -(cStack_2a8 == acStack_b0[8]);
    auVar57[9] = -(cStack_2a7 == acStack_b0[9]);
    auVar57[10] = -(cStack_2a6 == acStack_b0[10]);
    auVar57[0xb] = -(cStack_2a5 == acStack_b0[0xb]);
    auVar57[0xc] = -(cStack_2a4 == acStack_b0[0xc]);
    auVar57[0xd] = -(cStack_2a3 == acStack_b0[0xd]);
    auVar57[0xe] = -(cStack_2a2 == acStack_b0[0xe]);
    auVar57[0xf] = -(cStack_2a1 == acStack_b0[0xf]);
    auVar21 = auVar21 & auVar57;
    if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e155;
    puStack_2b8 = (undefined1 *)0x15c1f2;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15c20e;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x12) goto LAB_0015e15a;
    auVar22[0] = -(cStack_1a0 == 'm');
    auVar22[1] = -(cStack_19f == '\0');
    auVar22[2] = 0xff;
    auVar22[3] = 0xff;
    auVar22[4] = 0xff;
    auVar22[5] = 0xff;
    auVar22[6] = 0xff;
    auVar22[7] = 0xff;
    auVar22[8] = 0xff;
    auVar22[9] = 0xff;
    auVar22[10] = 0xff;
    auVar22[0xb] = 0xff;
    auVar22[0xc] = 0xff;
    auVar22[0xd] = 0xff;
    auVar22[0xe] = 0xff;
    auVar22[0xf] = 0xff;
    auVar58[0] = -(cStack_1b0 == acStack_b0[0]);
    auVar58[1] = -(cStack_1af == acStack_b0[1]);
    auVar58[2] = -(cStack_1ae == acStack_b0[2]);
    auVar58[3] = -(cStack_1ad == acStack_b0[3]);
    auVar58[4] = -(cStack_1ac == acStack_b0[4]);
    auVar58[5] = -(cStack_1ab == acStack_b0[5]);
    auVar58[6] = -(cStack_1aa == acStack_b0[6]);
    auVar58[7] = -(cStack_1a9 == acStack_b0[7]);
    auVar58[8] = -(cStack_1a8 == acStack_b0[8]);
    auVar58[9] = -(cStack_1a7 == acStack_b0[9]);
    auVar58[10] = -(cStack_1a6 == acStack_b0[10]);
    auVar58[0xb] = -(cStack_1a5 == acStack_b0[0xb]);
    auVar58[0xc] = -(cStack_1a4 == acStack_b0[0xc]);
    auVar58[0xd] = -(cStack_1a3 == acStack_b0[0xd]);
    auVar58[0xe] = -(cStack_1a2 == acStack_b0[0xe]);
    auVar58[0xf] = -(cStack_1a1 == acStack_b0[0xf]);
    auVar22 = auVar22 & auVar58;
    if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e15f;
    puStack_2b8 = (undefined1 *)0x15c266;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e164;
    puStack_2b8 = (undefined1 *)0x15c280;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15c294;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15c2b2;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_20,run_test_idna_toascii::s_20 + 0xd,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x12) goto LAB_0015e169;
    auVar23[0] = -(cStack_2a0 == 'm');
    auVar23[1] = -(cStack_29f == '\0');
    auVar23[2] = 0xff;
    auVar23[3] = 0xff;
    auVar23[4] = 0xff;
    auVar23[5] = 0xff;
    auVar23[6] = 0xff;
    auVar23[7] = 0xff;
    auVar23[8] = 0xff;
    auVar23[9] = 0xff;
    auVar23[10] = 0xff;
    auVar23[0xb] = 0xff;
    auVar23[0xc] = 0xff;
    auVar23[0xd] = 0xff;
    auVar23[0xe] = 0xff;
    auVar23[0xf] = 0xff;
    auVar59[0] = -(acStack_2b0[0] == acStack_b0[0]);
    auVar59[1] = -(acStack_2b0[1] == acStack_b0[1]);
    auVar59[2] = -(acStack_2b0[2] == acStack_b0[2]);
    auVar59[3] = -(acStack_2b0[3] == acStack_b0[3]);
    auVar59[4] = -(cStack_2ac == acStack_b0[4]);
    auVar59[5] = -(cStack_2ab == acStack_b0[5]);
    auVar59[6] = -(cStack_2aa == acStack_b0[6]);
    auVar59[7] = -(cStack_2a9 == acStack_b0[7]);
    auVar59[8] = -(cStack_2a8 == acStack_b0[8]);
    auVar59[9] = -(cStack_2a7 == acStack_b0[9]);
    auVar59[10] = -(cStack_2a6 == acStack_b0[10]);
    auVar59[0xb] = -(cStack_2a5 == acStack_b0[0xb]);
    auVar59[0xc] = -(cStack_2a4 == acStack_b0[0xc]);
    auVar59[0xd] = -(cStack_2a3 == acStack_b0[0xd]);
    auVar59[0xe] = -(cStack_2a2 == acStack_b0[0xe]);
    auVar59[0xf] = -(cStack_2a1 == acStack_b0[0xf]);
    auVar23 = auVar23 & auVar59;
    if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e16e;
    puStack_2b8 = (undefined1 *)0x15c2f9;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15c315;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x12) goto LAB_0015e173;
    auVar60[0] = -(acStack_b0[0] == cStack_1b0);
    auVar60[1] = -(acStack_b0[1] == cStack_1af);
    auVar60[2] = -(acStack_b0[2] == cStack_1ae);
    auVar60[3] = -(acStack_b0[3] == cStack_1ad);
    auVar60[4] = -(acStack_b0[4] == cStack_1ac);
    auVar60[5] = -(acStack_b0[5] == cStack_1ab);
    auVar60[6] = -(acStack_b0[6] == cStack_1aa);
    auVar60[7] = -(acStack_b0[7] == cStack_1a9);
    auVar60[8] = -(acStack_b0[8] == cStack_1a8);
    auVar60[9] = -(acStack_b0[9] == cStack_1a7);
    auVar60[10] = -(acStack_b0[10] == cStack_1a6);
    auVar60[0xb] = -(acStack_b0[0xb] == cStack_1a5);
    auVar60[0xc] = -(acStack_b0[0xc] == cStack_1a4);
    auVar60[0xd] = -(acStack_b0[0xd] == cStack_1a3);
    auVar60[0xe] = -(acStack_b0[0xe] == cStack_1a2);
    auVar60[0xf] = -(acStack_b0[0xf] == cStack_1a1);
    auVar24[0] = -(cStack_1a0 == 'm');
    auVar24[1] = -(cStack_19f == '\0');
    auVar24[2] = 0xff;
    auVar24[3] = 0xff;
    auVar24[4] = 0xff;
    auVar24[5] = 0xff;
    auVar24[6] = 0xff;
    auVar24[7] = 0xff;
    auVar24[8] = 0xff;
    auVar24[9] = 0xff;
    auVar24[10] = 0xff;
    auVar24[0xb] = 0xff;
    auVar24[0xc] = 0xff;
    auVar24[0xd] = 0xff;
    auVar24[0xe] = 0xff;
    auVar24[0xf] = 0xff;
    auVar24 = auVar24 & auVar60;
    if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e178;
    puStack_2b8 = (undefined1 *)0x15c36d;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e17d;
    puStack_2b8 = (undefined1 *)0x15c387;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15c39b;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15c3b9;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_21,run_test_idna_toascii::s_21 + 2,acStack_2b0
                             ,&cStack_1b0);
    if (lVar4 != 8) goto LAB_0015e182;
    if (CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x6164742d2d6e78)
    goto LAB_0015e187;
    puStack_2b8 = (undefined1 *)0x15c3e2;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15c3fe;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 8) goto LAB_0015e18c;
    if (CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x6164742d2d6e78) goto LAB_0015e191;
    puStack_2b8 = (undefined1 *)0x15c42b;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e196;
    puStack_2b8 = (undefined1 *)0x15c445;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15c459;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15c477;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_22,run_test_idna_toascii::s_22 + 3,acStack_2b0
                             ,&cStack_1b0);
    if (lVar4 != 9) goto LAB_0015e19b;
    if (cStack_2a8 != '\0' ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x6164742d2d6e782e)
    goto LAB_0015e1a0;
    puStack_2b8 = (undefined1 *)0x15c4ab;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15c4c7;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 9) goto LAB_0015e1a5;
    if (cStack_1a8 != '\0' ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x6164742d2d6e782e) goto LAB_0015e1aa;
    puStack_2b8 = (undefined1 *)0x15c4ff;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e1af;
    puStack_2b8 = (undefined1 *)0x15c519;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15c52d;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15c54b;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_23,run_test_idna_toascii::s_23 + 5,acStack_2b0
                             ,&cStack_1b0);
    if (lVar4 != 0x10) goto LAB_0015e1b4;
    auVar25[0] = -(acStack_2b0[0] == 'x');
    auVar25[1] = -(acStack_2b0[1] == 'n');
    auVar25[2] = -(acStack_2b0[2] == '-');
    auVar25[3] = -(acStack_2b0[3] == '-');
    auVar25[4] = -(cStack_2ac == 't');
    auVar25[5] = -(cStack_2ab == 'd');
    auVar25[6] = -(cStack_2aa == 'a');
    auVar25[7] = -(cStack_2a9 == '.');
    auVar25[8] = -(cStack_2a8 == 'x');
    auVar25[9] = -(cStack_2a7 == 'n');
    auVar25[10] = -(cStack_2a6 == '-');
    auVar25[0xb] = -(cStack_2a5 == '-');
    auVar25[0xc] = -(cStack_2a4 == 't');
    auVar25[0xd] = -(cStack_2a3 == 'd');
    auVar25[0xe] = -(cStack_2a2 == 'a');
    auVar25[0xf] = -(cStack_2a1 == '\0');
    if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe | (ushort)(auVar25[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_0015e1b9;
    puStack_2b8 = (undefined1 *)0x15c57c;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15c598;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x10) goto LAB_0015e1be;
    if (CONCAT17(cStack_1a1,
                 CONCAT16(cStack_1a2,
                          CONCAT15(cStack_1a3,
                                   CONCAT14(cStack_1a4,
                                            CONCAT13(cStack_1a5,
                                                     CONCAT12(cStack_1a6,
                                                              CONCAT11(cStack_1a7,cStack_1a8)))))))
        != 0x6164742d2d6e78 ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x2e6164742d2d6e78) goto LAB_0015e1c3;
    puStack_2b8 = (undefined1 *)0x15c5dd;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e1c8;
    puStack_2b8 = (undefined1 *)0x15c5f7;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15c60b;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15c629;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_24,run_test_idna_toascii::s_24 + 6,acStack_2b0
                             ,&cStack_1b0);
    if (lVar4 != 0x11) goto LAB_0015e1cd;
    if ((cStack_2a0 != '\0' ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x2e6164742d2d6e78)
        || CONCAT17(cStack_2a1,
                    CONCAT16(cStack_2a2,
                             CONCAT15(cStack_2a3,
                                      CONCAT14(cStack_2a4,
                                               CONCAT13(cStack_2a5,
                                                        CONCAT12(cStack_2a6,
                                                                 CONCAT11(cStack_2a7,cStack_2a8)))))
                            )) != 0x2e6164742d2d6e78) goto LAB_0015e1d2;
    puStack_2b8 = (undefined1 *)0x15c65e;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15c67a;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x11) goto LAB_0015e1d7;
    if ((cStack_1a0 != '\0' ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x2e6164742d2d6e78) ||
        CONCAT17(cStack_1a1,
                 CONCAT16(cStack_1a2,
                          CONCAT15(cStack_1a3,
                                   CONCAT14(cStack_1a4,
                                            CONCAT13(cStack_1a5,
                                                     CONCAT12(cStack_1a6,
                                                              CONCAT11(cStack_1a7,cStack_1a8)))))))
        != 0x2e6164742d2d6e78) goto LAB_0015e1dc;
    puStack_2b8 = (undefined1 *)0x15c6c0;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e1e1;
    puStack_2b8 = (undefined1 *)0x15c6da;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15c6ee;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15c70c;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_25,run_test_idna_toascii::s_25 + 0xb,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x11) goto LAB_0015e1e6;
    if ((cStack_2a0 != '\0' ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x6e6163342d2d6e78)
        || CONCAT17(cStack_2a1,
                    CONCAT16(cStack_2a2,
                             CONCAT15(cStack_2a3,
                                      CONCAT14(cStack_2a4,
                                               CONCAT13(cStack_2a5,
                                                        CONCAT12(cStack_2a6,
                                                                 CONCAT11(cStack_2a7,cStack_2a8)))))
                            )) != 0x6239303032766138) goto LAB_0015e1eb;
    puStack_2b8 = (undefined1 *)0x15c755;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15c771;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x11) goto LAB_0015e1f0;
    if ((cStack_1a0 != '\0' ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x6e6163342d2d6e78) ||
        CONCAT17(cStack_1a1,
                 CONCAT16(cStack_1a2,
                          CONCAT15(cStack_1a3,
                                   CONCAT14(cStack_1a4,
                                            CONCAT13(cStack_1a5,
                                                     CONCAT12(cStack_1a6,
                                                              CONCAT11(cStack_1a7,cStack_1a8)))))))
        != 0x6239303032766138) goto LAB_0015e1f5;
    puStack_2b8 = (undefined1 *)0x15c7b4;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e1fa;
    puStack_2b8 = (undefined1 *)0x15c7ce;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15c7e2;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15c800;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_26,run_test_idna_toascii::s_26 + 0x44,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x4b) goto LAB_0015e1ff;
    puStack_2b8 = (undefined1 *)0x15c81e;
    iVar3 = bcmp(acStack_2b0,
                 "xn--Willst du die Blthe des frhen, die Frchte des spteren Jahres-x9e96lkal",0x4b);
    if (iVar3 != 0) goto LAB_0015e204;
    puStack_2b8 = (undefined1 *)0x15c831;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15c84d;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x4b) goto LAB_0015e209;
    puStack_2b8 = (undefined1 *)0x15c870;
    iVar3 = bcmp(&cStack_1b0,
                 "xn--Willst du die Blthe des frhen, die Frchte des spteren Jahres-x9e96lkal",0x4b);
    if (iVar3 != 0) goto LAB_0015e20e;
    puStack_2b8 = (undefined1 *)0x15c88d;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e213;
    puStack_2b8 = (undefined1 *)0x15c8a7;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15c8bb;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15c8d9;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_27,run_test_idna_toascii::s_27 + 0x22,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x1b) goto LAB_0015e218;
    auVar61[0] = -(cStack_2a5 == '6');
    auVar61[1] = -(cStack_2a4 == 'b');
    auVar61[2] = -(cStack_2a3 == 'u');
    auVar61[3] = -(cStack_2a2 == '4');
    auVar61[4] = -(cStack_2a1 == 'b');
    auVar61[5] = -(cStack_2a0 == 'x');
    auVar61[6] = -(cStack_29f == 'f');
    auVar61[7] = -(cStack_29e == 'g');
    auVar61[8] = -(cStack_29d == 'e');
    auVar61[9] = -(cStack_29c == 'h');
    auVar61[10] = -(cStack_29b == 'f');
    auVar61[0xb] = -(cStack_29a == 'v');
    auVar61[0xc] = -(cStack_299 == 'w');
    auVar61[0xd] = -(cStack_298 == 'x');
    auVar61[0xe] = -(cStack_297 == 'n');
    auVar61[0xf] = -(cStack_296 == '\0');
    auVar26[0] = -(acStack_2b0[0] == 'x');
    auVar26[1] = -(acStack_2b0[1] == 'n');
    auVar26[2] = -(acStack_2b0[2] == '-');
    auVar26[3] = -(acStack_2b0[3] == '-');
    auVar26[4] = -(cStack_2ac == 'e');
    auVar26[5] = -(cStack_2ab == 'g');
    auVar26[6] = -(cStack_2aa == 'b');
    auVar26[7] = -(cStack_2a9 == 'p');
    auVar26[8] = -(cStack_2a8 == 'd');
    auVar26[9] = -(cStack_2a7 == 'a');
    auVar26[10] = -(cStack_2a6 == 'j');
    auVar26[0xb] = -(cStack_2a5 == '6');
    auVar26[0xc] = -(cStack_2a4 == 'b');
    auVar26[0xd] = -(cStack_2a3 == 'u');
    auVar26[0xe] = -(cStack_2a2 == '4');
    auVar26[0xf] = -(cStack_2a1 == 'b');
    auVar26 = auVar26 & auVar61;
    if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) | (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e21d;
    puStack_2b8 = (undefined1 *)0x15c91c;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15c938;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x1b) goto LAB_0015e222;
    auVar27[0] = -(cStack_1b0 == 'x');
    auVar27[1] = -(cStack_1af == 'n');
    auVar27[2] = -(cStack_1ae == '-');
    auVar27[3] = -(cStack_1ad == '-');
    auVar27[4] = -(cStack_1ac == 'e');
    auVar27[5] = -(cStack_1ab == 'g');
    auVar27[6] = -(cStack_1aa == 'b');
    auVar27[7] = -(cStack_1a9 == 'p');
    auVar27[8] = -(cStack_1a8 == 'd');
    auVar27[9] = -(cStack_1a7 == 'a');
    auVar27[10] = -(cStack_1a6 == 'j');
    auVar27[0xb] = -(cStack_1a5 == '6');
    auVar27[0xc] = -(cStack_1a4 == 'b');
    auVar27[0xd] = -(cStack_1a3 == 'u');
    auVar27[0xe] = -(cStack_1a2 == '4');
    auVar27[0xf] = -(cStack_1a1 == 'b');
    auVar76[0] = -(cStack_1a5 == '6');
    auVar76[1] = -(cStack_1a4 == 'b');
    auVar76[2] = -(cStack_1a3 == 'u');
    auVar76[3] = -(cStack_1a2 == '4');
    auVar76[4] = -(cStack_1a1 == 'b');
    auVar76[5] = -(cStack_1a0 == 'x');
    auVar76[6] = -(cStack_19f == 'f');
    auVar76[7] = -(cStack_19e == 'g');
    auVar76[8] = -(cStack_19d == 'e');
    auVar76[9] = -(cStack_19c == 'h');
    auVar76[10] = -(cStack_19b == 'f');
    auVar76[0xb] = -(cStack_19a == 'v');
    auVar76[0xc] = -(cStack_199 == 'w');
    auVar76[0xd] = -(cStack_198 == 'x');
    auVar76[0xe] = -(cStack_197 == 'n');
    auVar76[0xf] = -(cStack_196 == '\0');
    auVar27 = auVar27 & auVar76;
    if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) | (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e227;
    puStack_2b8 = (undefined1 *)0x15c9c4;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e22c;
    puStack_2b8 = (undefined1 *)0x15c9de;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15c9f2;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15ca10;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_28,run_test_idna_toascii::s_28 + 0x1b,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x1d) goto LAB_0015e231;
    auVar62[0] = -(cStack_2a3 == 'v');
    auVar62[1] = -(cStack_2a2 == '8');
    auVar62[2] = -(cStack_2a1 == 'a');
    auVar62[3] = -(cStack_2a0 == '8');
    auVar62[4] = -(cStack_29f == 'd');
    auVar62[5] = -(cStack_29e == 'q');
    auVar62[6] = -(cStack_29d == 'g');
    auVar62[7] = -(cStack_29c == '0');
    auVar62[8] = -(cStack_29b == '5');
    auVar62[9] = -(cStack_29a == '6');
    auVar62[10] = -(cStack_299 == 'p');
    auVar62[0xb] = -(cStack_298 == 'q');
    auVar62[0xc] = -(cStack_297 == 'j');
    auVar62[0xd] = -(cStack_296 == 'y');
    auVar62[0xe] = -(cStack_295 == 'e');
    auVar62[0xf] = -(cStack_294 == '\0');
    auVar28[0] = -(acStack_2b0[0] == 'x');
    auVar28[1] = -(acStack_2b0[1] == 'n');
    auVar28[2] = -(acStack_2b0[2] == '-');
    auVar28[3] = -(acStack_2b0[3] == '-');
    auVar28[4] = -(cStack_2ac == 'i');
    auVar28[5] = -(cStack_2ab == 'h');
    auVar28[6] = -(cStack_2aa == 'q');
    auVar28[7] = -(cStack_2a9 == 'w');
    auVar28[8] = -(cStack_2a8 == 'c');
    auVar28[9] = -(cStack_2a7 == 'r');
    auVar28[10] = -(cStack_2a6 == 'b');
    auVar28[0xb] = -(cStack_2a5 == '4');
    auVar28[0xc] = -(cStack_2a4 == 'c');
    auVar28[0xd] = -(cStack_2a3 == 'v');
    auVar28[0xe] = -(cStack_2a2 == '8');
    auVar28[0xf] = -(cStack_2a1 == 'a');
    auVar28 = auVar28 & auVar62;
    if ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar28[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e236;
    puStack_2b8 = (undefined1 *)0x15ca53;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15ca6f;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x1d) goto LAB_0015e23b;
    builtin_strncpy(acStack_b0,"xn--ihqw",9);
    acStack_b0[9] = '\0';
    acStack_b0[10] = '\0';
    acStack_b0[0xb] = '\0';
    acStack_b0[0xc] = '\0';
    acStack_b0[0xd] = '\0';
    acStack_b0[0xe] = '\0';
    acStack_b0[0xf] = '\0';
    auVar63[0] = -(cStack_1b0 == 'x');
    auVar63[1] = -(cStack_1af == 'n');
    auVar63[2] = -(cStack_1ae == '-');
    auVar63[3] = -(cStack_1ad == '-');
    auVar63[4] = -(cStack_1ac == 'i');
    auVar63[5] = -(cStack_1ab == 'h');
    auVar63[6] = -(cStack_1aa == 'q');
    auVar63[7] = -(cStack_1a9 == 'w');
    auVar63[8] = -(cStack_1a8 == 'c');
    auVar63[9] = -(cStack_1a7 == 'r');
    auVar63[10] = -(cStack_1a6 == 'b');
    auVar63[0xb] = -(cStack_1a5 == '4');
    auVar63[0xc] = -(cStack_1a4 == 'c');
    auVar63[0xd] = -(cStack_1a3 == 'v');
    auVar63[0xe] = -(cStack_1a2 == '8');
    auVar63[0xf] = -(cStack_1a1 == 'a');
    auVar77[0] = -(cStack_1a3 == 'v');
    auVar77[1] = -(cStack_1a2 == '8');
    auVar77[2] = -(cStack_1a1 == 'a');
    auVar77[3] = -(cStack_1a0 == '8');
    auVar77[4] = -(cStack_19f == 'd');
    auVar77[5] = -(cStack_19e == 'q');
    auVar77[6] = -(cStack_19d == 'g');
    auVar77[7] = -(cStack_19c == '0');
    auVar77[8] = -(cStack_19b == '5');
    auVar77[9] = -(cStack_19a == '6');
    auVar77[10] = -(cStack_199 == 'p');
    auVar77[0xb] = -(cStack_198 == 'q');
    auVar77[0xc] = -(cStack_197 == 'j');
    auVar77[0xd] = -(cStack_196 == 'y');
    auVar77[0xe] = -(cStack_195 == 'e');
    auVar77[0xf] = -(cStack_194 == '\0');
    auVar63 = auVar63 & auVar77;
    if ((ushort)((ushort)(SUB161(auVar63 >> 7,0) & 1) | (ushort)(SUB161(auVar63 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar63 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar63 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar63 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar63 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar63 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar63 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar63 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar63 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar63 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar63 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar63 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar63 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar63 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar63[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e240;
    puStack_2b8 = (undefined1 *)0x15cb04;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e245;
    puStack_2b8 = (undefined1 *)0x15cb1e;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15cb32;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15cb50;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_29,run_test_idna_toascii::s_29 + 0x1b,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x20) goto LAB_0015e24a;
    auVar64[0] = -(cStack_2a0 == '6');
    auVar64[1] = -(cStack_29f == '5');
    auVar64[2] = -(cStack_29e == '9');
    auVar64[3] = -(cStack_29d == 'd');
    auVar64[4] = -(cStack_29c == 'r');
    auVar64[5] = -(cStack_29b == 's');
    auVar64[6] = -(cStack_29a == 's');
    auVar64[7] = -(cStack_299 == '3');
    auVar64[8] = -(cStack_298 == 'x');
    auVar64[9] = -(cStack_297 == '8');
    auVar64[10] = -(cStack_296 == 'b');
    auVar64[0xb] = -(cStack_295 == 'o');
    auVar64[0xc] = -(cStack_294 == '0');
    auVar64[0xd] = -(cStack_293 == 'y');
    auVar64[0xe] = -(cStack_292 == 'b');
    auVar64[0xf] = -(cStack_291 == '\0');
    auVar29[0] = -(acStack_2b0[0] == 'x');
    auVar29[1] = -(acStack_2b0[1] == 'n');
    auVar29[2] = -(acStack_2b0[2] == '-');
    auVar29[3] = -(acStack_2b0[3] == '-');
    auVar29[4] = -(cStack_2ac == 'i');
    auVar29[5] = -(cStack_2ab == 'h');
    auVar29[6] = -(cStack_2aa == 'q');
    auVar29[7] = -(cStack_2a9 == 'w');
    auVar29[8] = -(cStack_2a8 == 'c');
    auVar29[9] = -(cStack_2a7 == 't');
    auVar29[10] = -(cStack_2a6 == 'v');
    auVar29[0xb] = -(cStack_2a5 == 'z');
    auVar29[0xc] = -(cStack_2a4 == 'c');
    auVar29[0xd] = -(cStack_2a3 == '9');
    auVar29[0xe] = -(cStack_2a2 == '1');
    auVar29[0xf] = -(cStack_2a1 == 'f');
    auVar29 = auVar29 & auVar64;
    if ((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar29[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e24f;
    puStack_2b8 = (undefined1 *)0x15cb93;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15cbaf;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x20) goto LAB_0015e254;
    auVar30[0] = -(cStack_1a0 == '6');
    auVar30[1] = -(cStack_19f == '5');
    auVar30[2] = -(cStack_19e == '9');
    auVar30[3] = -(cStack_19d == 'd');
    auVar30[4] = -(cStack_19c == 'r');
    auVar30[5] = -(cStack_19b == 's');
    auVar30[6] = -(cStack_19a == 's');
    auVar30[7] = -(cStack_199 == '3');
    auVar30[8] = -(cStack_198 == 'x');
    auVar30[9] = -(cStack_197 == '8');
    auVar30[10] = -(cStack_196 == 'b');
    auVar30[0xb] = -(cStack_195 == 'o');
    auVar30[0xc] = -(cStack_194 == '0');
    auVar30[0xd] = -(cStack_193 == 'y');
    auVar30[0xe] = -(cStack_192 == 'b');
    auVar30[0xf] = -(cStack_191 == '\0');
    auVar78[0] = -(acStack_b0[0] == cStack_1b0);
    auVar78[1] = -(acStack_b0[1] == cStack_1af);
    auVar78[2] = -(acStack_b0[2] == cStack_1ae);
    auVar78[3] = -(acStack_b0[3] == cStack_1ad);
    auVar78[4] = -(acStack_b0[4] == cStack_1ac);
    auVar78[5] = -(acStack_b0[5] == cStack_1ab);
    auVar78[6] = -(acStack_b0[6] == cStack_1aa);
    auVar78[7] = -(acStack_b0[7] == cStack_1a9);
    auVar78[8] = -(cStack_1a8 == 'c');
    auVar78[9] = -(cStack_1a7 == 't');
    auVar78[10] = -(cStack_1a6 == 'v');
    auVar78[0xb] = -(cStack_1a5 == 'z');
    auVar78[0xc] = -(cStack_1a4 == 'c');
    auVar78[0xd] = -(cStack_1a3 == '9');
    auVar78[0xe] = -(cStack_1a2 == '1');
    auVar78[0xf] = -(cStack_1a1 == 'f');
    auVar78 = auVar78 & auVar30;
    if ((ushort)((ushort)(SUB161(auVar78 >> 7,0) & 1) | (ushort)(SUB161(auVar78 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar78 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar78 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar78 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar78 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar78 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar78 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar78 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar78 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar78 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar78 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar78 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar78 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar78 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar78[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e259;
    puStack_2b8 = (undefined1 *)0x15cc31;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e25e;
    puStack_2b8 = (undefined1 *)0x15cc4b;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15cc5f;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15cc7d;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_30,run_test_idna_toascii::s_30 + 0x1a,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x23) goto LAB_0015e263;
    puStack_2b8 = (undefined1 *)0x15cc9b;
    iVar3 = bcmp(acStack_2b0,"xn--Proprostnemluvesky-uyb24dma41a",0x23);
    if (iVar3 != 0) goto LAB_0015e268;
    puStack_2b8 = (undefined1 *)0x15ccae;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15ccca;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x23) goto LAB_0015e26d;
    puStack_2b8 = (undefined1 *)0x15cced;
    iVar3 = bcmp(&cStack_1b0,"xn--Proprostnemluvesky-uyb24dma41a",0x23);
    if (iVar3 != 0) goto LAB_0015e272;
    puStack_2b8 = (undefined1 *)0x15cd0a;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e277;
    puStack_2b8 = (undefined1 *)0x15cd24;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15cd38;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15cd56;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_31,run_test_idna_toascii::s_31 + 0x2c,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x21) goto LAB_0015e27c;
    puStack_2b8 = (undefined1 *)0x15cd74;
    iVar3 = bcmp(acStack_2b0,"xn--4dbcagdahymbxekheh6e0a7fei0b",0x21);
    if (iVar3 != 0) goto LAB_0015e281;
    puStack_2b8 = (undefined1 *)0x15cd87;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15cda3;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x21) goto LAB_0015e286;
    puStack_2b8 = (undefined1 *)0x15cdc6;
    iVar3 = bcmp(&cStack_1b0,"xn--4dbcagdahymbxekheh6e0a7fei0b",0x21);
    if (iVar3 != 0) goto LAB_0015e28b;
    puStack_2b8 = (undefined1 *)0x15cde3;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e290;
    puStack_2b8 = (undefined1 *)0x15cdfd;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15ce11;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15ce2f;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_32,run_test_idna_toascii::s_32 + 0x5a,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x31) goto LAB_0015e295;
    puStack_2b8 = (undefined1 *)0x15ce4d;
    iVar3 = bcmp(acStack_2b0,"xn--i1baa7eci9glrd9b2ae1bj0hfcgg6iyaf8o0a1dig0cd",0x31);
    if (iVar3 != 0) goto LAB_0015e29a;
    puStack_2b8 = (undefined1 *)0x15ce60;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15ce7c;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x31) goto LAB_0015e29f;
    puStack_2b8 = (undefined1 *)0x15ce9f;
    iVar3 = bcmp(&cStack_1b0,"xn--i1baa7eci9glrd9b2ae1bj0hfcgg6iyaf8o0a1dig0cd",0x31);
    if (iVar3 != 0) goto LAB_0015e2a4;
    puStack_2b8 = (undefined1 *)0x15cebc;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e2a9;
    puStack_2b8 = (undefined1 *)0x15ced6;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15ceea;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15cf08;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_33,run_test_idna_toascii::s_33 + 0x36,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x2b) goto LAB_0015e2ae;
    puStack_2b8 = (undefined1 *)0x15cf26;
    iVar3 = bcmp(acStack_2b0,"xn--n8jok5ay5dzabd5bym9f0cm5685rrjetr6pdxa",0x2b);
    if (iVar3 != 0) goto LAB_0015e2b3;
    puStack_2b8 = (undefined1 *)0x15cf39;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15cf55;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x2b) goto LAB_0015e2b8;
    puStack_2b8 = (undefined1 *)0x15cf78;
    iVar3 = bcmp(&cStack_1b0,"xn--n8jok5ay5dzabd5bym9f0cm5685rrjetr6pdxa",0x2b);
    if (iVar3 != 0) goto LAB_0015e2bd;
    puStack_2b8 = (undefined1 *)0x15cf95;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e2c2;
    puStack_2b8 = (undefined1 *)0x15cfaf;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15cfc3;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15cfe1;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_34,run_test_idna_toascii::s_34 + 0x48,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x4a) goto LAB_0015e2c7;
    puStack_2b8 = (undefined1 *)0x15cfff;
    iVar3 = bcmp(acStack_2b0,
                 "xn--989aomsvi5e83db1d2a355cv1e0vak1dwrv93d5xbh15a0dt30a5jpsd879ccm6fea98c",0x4a);
    if (iVar3 != 0) goto LAB_0015e2cc;
    puStack_2b8 = (undefined1 *)0x15d012;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15d02e;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x4a) goto LAB_0015e2d1;
    puStack_2b8 = (undefined1 *)0x15d051;
    iVar3 = bcmp(&cStack_1b0,
                 "xn--989aomsvi5e83db1d2a355cv1e0vak1dwrv93d5xbh15a0dt30a5jpsd879ccm6fea98c",0x4a);
    if (iVar3 != 0) goto LAB_0015e2d6;
    puStack_2b8 = (undefined1 *)0x15d06e;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e2db;
    puStack_2b8 = (undefined1 *)0x15d088;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d09c;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d0ba;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_35,run_test_idna_toascii::s_35 + 0x38,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x25) goto LAB_0015e2e0;
    puStack_2b8 = (undefined1 *)0x15d0d8;
    iVar3 = bcmp(acStack_2b0,"xn--b1abfaaepdrnnbgefbadotcwatmq2g4l",0x25);
    if (iVar3 != 0) goto LAB_0015e2e5;
    puStack_2b8 = (undefined1 *)0x15d0eb;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15d107;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x25) goto LAB_0015e2ea;
    puStack_2b8 = (undefined1 *)0x15d12a;
    iVar3 = bcmp(&cStack_1b0,"xn--b1abfaaepdrnnbgefbadotcwatmq2g4l",0x25);
    if (iVar3 != 0) goto LAB_0015e2ef;
    puStack_2b8 = (undefined1 *)0x15d147;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e2f4;
    puStack_2b8 = (undefined1 *)0x15d161;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d175;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d193;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_36,run_test_idna_toascii::s_36 + 0x2a,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x32) goto LAB_0015e2f9;
    puStack_2b8 = (undefined1 *)0x15d1b1;
    iVar3 = bcmp(acStack_2b0,"xn--PorqunopuedensimplementehablarenEspaol-fmd56a",0x32);
    if (iVar3 != 0) goto LAB_0015e2fe;
    puStack_2b8 = (undefined1 *)0x15d1c4;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15d1e0;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x32) goto LAB_0015e303;
    puStack_2b8 = (undefined1 *)0x15d203;
    iVar3 = bcmp(&cStack_1b0,"xn--PorqunopuedensimplementehablarenEspaol-fmd56a",0x32);
    if (iVar3 != 0) goto LAB_0015e308;
    puStack_2b8 = (undefined1 *)0x15d220;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e30d;
    puStack_2b8 = (undefined1 *)0x15d23a;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d24e;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d26c;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_37,run_test_idna_toascii::s_37 + 0x2d,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x31) goto LAB_0015e312;
    puStack_2b8 = (undefined1 *)0x15d28a;
    iVar3 = bcmp(acStack_2b0,"xn--TisaohkhngthchnitingVit-kjcr8268qyxafd2f1b9g",0x31);
    if (iVar3 != 0) goto LAB_0015e317;
    puStack_2b8 = (undefined1 *)0x15d29d;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15d2b9;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x31) goto LAB_0015e31c;
    puStack_2b8 = (undefined1 *)0x15d2dc;
    iVar3 = bcmp(&cStack_1b0,"xn--TisaohkhngthchnitingVit-kjcr8268qyxafd2f1b9g",0x31);
    if (iVar3 != 0) goto LAB_0015e321;
    puStack_2b8 = (undefined1 *)0x15d2f9;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e326;
    puStack_2b8 = (undefined1 *)0x15d313;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d327;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d345;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_38,run_test_idna_toascii::s_38 + 0x14,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x1d) goto LAB_0015e32b;
    auVar65[0] = -(cStack_2a3 == '1');
    auVar65[1] = -(cStack_2a2 == '8');
    auVar65[2] = -(cStack_2a1 == '0');
    auVar65[3] = -(cStack_2a0 == 'e');
    auVar65[4] = -(cStack_29f == '5');
    auVar65[5] = -(cStack_29e == '7');
    auVar65[6] = -(cStack_29d == '5');
    auVar65[7] = -(cStack_29c == 'a');
    auVar65[8] = -(cStack_29b == '6');
    auVar65[9] = -(cStack_29a == '5');
    auVar65[10] = -(cStack_299 == 'l');
    auVar65[0xb] = -(cStack_298 == 's');
    auVar65[0xc] = -(cStack_297 == 'y');
    auVar65[0xd] = -(cStack_296 == '2');
    auVar65[0xe] = -(cStack_295 == 'b');
    auVar65[0xf] = -(cStack_294 == '\0');
    auVar31[0] = -(acStack_2b0[0] == 'x');
    auVar31[1] = -(acStack_2b0[1] == 'n');
    auVar31[2] = -(acStack_2b0[2] == '-');
    auVar31[3] = -(acStack_2b0[3] == '-');
    auVar31[4] = -(cStack_2ac == '3');
    auVar31[5] = -(cStack_2ab == 'B');
    auVar31[6] = -(cStack_2aa == '-');
    auVar31[7] = -(cStack_2a9 == 'w');
    auVar31[8] = -(cStack_2a8 == 'w');
    auVar31[9] = -(cStack_2a7 == '4');
    auVar31[10] = -(cStack_2a6 == 'c');
    auVar31[0xb] = -(cStack_2a5 == '5');
    auVar31[0xc] = -(cStack_2a4 == 'e');
    auVar31[0xd] = -(cStack_2a3 == '1');
    auVar31[0xe] = -(cStack_2a2 == '8');
    auVar31[0xf] = -(cStack_2a1 == '0');
    auVar31 = auVar31 & auVar65;
    if ((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e330;
    puStack_2b8 = (undefined1 *)0x15d388;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15d3a4;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x1d) goto LAB_0015e335;
    auVar32[0] = -(cStack_1b0 == 'x');
    auVar32[1] = -(cStack_1af == 'n');
    auVar32[2] = -(cStack_1ae == '-');
    auVar32[3] = -(cStack_1ad == '-');
    auVar32[4] = -(cStack_1ac == '3');
    auVar32[5] = -(cStack_1ab == 'B');
    auVar32[6] = -(cStack_1aa == '-');
    auVar32[7] = -(cStack_1a9 == 'w');
    auVar32[8] = -(cStack_1a8 == 'w');
    auVar32[9] = -(cStack_1a7 == '4');
    auVar32[10] = -(cStack_1a6 == 'c');
    auVar32[0xb] = -(cStack_1a5 == '5');
    auVar32[0xc] = -(cStack_1a4 == 'e');
    auVar32[0xd] = -(cStack_1a3 == '1');
    auVar32[0xe] = -(cStack_1a2 == '8');
    auVar32[0xf] = -(cStack_1a1 == '0');
    auVar79[0] = -(cStack_1a3 == '1');
    auVar79[1] = -(cStack_1a2 == '8');
    auVar79[2] = -(cStack_1a1 == '0');
    auVar79[3] = -(cStack_1a0 == 'e');
    auVar79[4] = -(cStack_19f == '5');
    auVar79[5] = -(cStack_19e == '7');
    auVar79[6] = -(cStack_19d == '5');
    auVar79[7] = -(cStack_19c == 'a');
    auVar79[8] = -(cStack_19b == '6');
    auVar79[9] = -(cStack_19a == '5');
    auVar79[10] = -(cStack_199 == 'l');
    auVar79[0xb] = -(cStack_198 == 's');
    auVar79[0xc] = -(cStack_197 == 'y');
    auVar79[0xd] = -(cStack_196 == '2');
    auVar79[0xe] = -(cStack_195 == 'b');
    auVar79[0xf] = -(cStack_194 == '\0');
    auVar32 = auVar32 & auVar79;
    if ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e33a;
    puStack_2b8 = (undefined1 *)0x15d430;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e33f;
    puStack_2b8 = (undefined1 *)0x15d44a;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d45e;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d47c;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_39,run_test_idna_toascii::s_39 + 0x22,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x2d) goto LAB_0015e344;
    puStack_2b8 = (undefined1 *)0x15d49a;
    iVar3 = bcmp(acStack_2b0,"xn---with-SUPER-MONKEYS-pc58ag80a8qai00g7n9n",0x2d);
    if (iVar3 != 0) goto LAB_0015e349;
    puStack_2b8 = (undefined1 *)0x15d4ad;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15d4c9;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x2d) goto LAB_0015e34e;
    puStack_2b8 = (undefined1 *)0x15d4ec;
    iVar3 = bcmp(&cStack_1b0,"xn---with-SUPER-MONKEYS-pc58ag80a8qai00g7n9n",0x2d);
    if (iVar3 != 0) goto LAB_0015e353;
    puStack_2b8 = (undefined1 *)0x15d509;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e358;
    puStack_2b8 = (undefined1 *)0x15d523;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d537;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d555;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_40,run_test_idna_toascii::s_40 + 0x27,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x2d) goto LAB_0015e35d;
    puStack_2b8 = (undefined1 *)0x15d573;
    iVar3 = bcmp(acStack_2b0,"xn--Hello-Another-Way--fc4qua05auwb3674vfr0b",0x2d);
    if (iVar3 != 0) goto LAB_0015e362;
    puStack_2b8 = (undefined1 *)0x15d586;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15d5a2;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x2d) goto LAB_0015e367;
    puStack_2b8 = (undefined1 *)0x15d5c5;
    iVar3 = bcmp(&cStack_1b0,"xn--Hello-Another-Way--fc4qua05auwb3674vfr0b",0x2d);
    if (iVar3 != 0) goto LAB_0015e36c;
    puStack_2b8 = (undefined1 *)0x15d5e2;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e371;
    puStack_2b8 = (undefined1 *)0x15d5fc;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d610;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d62e;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_41,run_test_idna_toascii::s_41 + 0x16,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x18) goto LAB_0015e376;
    auVar66[0] = -(cStack_2a0 == 'b');
    auVar66[1] = -(cStack_29f == 't');
    auVar66[2] = -(cStack_29e == '3');
    auVar66[3] = -(cStack_29d == 'u');
    auVar66[4] = -(cStack_29c == 'c');
    auVar66[5] = -(cStack_29b == '0');
    auVar66[6] = -(cStack_29a == 'v');
    auVar66[7] = -(cStack_299 == '\0');
    auVar66[8] = 0xff;
    auVar66[9] = 0xff;
    auVar66[10] = 0xff;
    auVar66[0xb] = 0xff;
    auVar66[0xc] = 0xff;
    auVar66[0xd] = 0xff;
    auVar66[0xe] = 0xff;
    auVar66[0xf] = 0xff;
    auVar33[0] = -(acStack_2b0[0] == 'x');
    auVar33[1] = -(acStack_2b0[1] == 'n');
    auVar33[2] = -(acStack_2b0[2] == '-');
    auVar33[3] = -(acStack_2b0[3] == '-');
    auVar33[4] = -(cStack_2ac == '2');
    auVar33[5] = -(cStack_2ab == '-');
    auVar33[6] = -(cStack_2aa == 'u');
    auVar33[7] = -(cStack_2a9 == '9');
    auVar33[8] = -(cStack_2a8 == 't');
    auVar33[9] = -(cStack_2a7 == 'l');
    auVar33[10] = -(cStack_2a6 == 'z');
    auVar33[0xb] = -(cStack_2a5 == 'r');
    auVar33[0xc] = -(cStack_2a4 == '9');
    auVar33[0xd] = -(cStack_2a3 == '7');
    auVar33[0xe] = -(cStack_2a2 == '5');
    auVar33[0xf] = -(cStack_2a1 == '6');
    auVar33 = auVar33 & auVar66;
    if ((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e37b;
    puStack_2b8 = (undefined1 *)0x15d671;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15d68d;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x18) goto LAB_0015e380;
    auVar34[0] = -(cStack_1b0 == 'x');
    auVar34[1] = -(cStack_1af == 'n');
    auVar34[2] = -(cStack_1ae == '-');
    auVar34[3] = -(cStack_1ad == '-');
    auVar34[4] = -(cStack_1ac == '2');
    auVar34[5] = -(cStack_1ab == '-');
    auVar34[6] = -(cStack_1aa == 'u');
    auVar34[7] = -(cStack_1a9 == '9');
    auVar34[8] = -(cStack_1a8 == 't');
    auVar34[9] = -(cStack_1a7 == 'l');
    auVar34[10] = -(cStack_1a6 == 'z');
    auVar34[0xb] = -(cStack_1a5 == 'r');
    auVar34[0xc] = -(cStack_1a4 == '9');
    auVar34[0xd] = -(cStack_1a3 == '7');
    auVar34[0xe] = -(cStack_1a2 == '5');
    auVar34[0xf] = -(cStack_1a1 == '6');
    auVar67[0] = -(cStack_1a0 == 'b');
    auVar67[1] = -(cStack_19f == 't');
    auVar67[2] = -(cStack_19e == '3');
    auVar67[3] = -(cStack_19d == 'u');
    auVar67[4] = -(cStack_19c == 'c');
    auVar67[5] = -(cStack_19b == '0');
    auVar67[6] = -(cStack_19a == 'v');
    auVar67[7] = -(cStack_199 == '\0');
    auVar67[8] = 0xff;
    auVar67[9] = 0xff;
    auVar67[10] = 0xff;
    auVar67[0xb] = 0xff;
    auVar67[0xc] = 0xff;
    auVar67[0xd] = 0xff;
    auVar67[0xe] = 0xff;
    auVar67[0xf] = 0xff;
    auVar67 = auVar67 & auVar34;
    if ((ushort)((ushort)(SUB161(auVar67 >> 7,0) & 1) | (ushort)(SUB161(auVar67 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar67 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar67 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar67 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar67 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar67 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar67 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar67 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar67 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar67 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar67 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar67 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar67[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e385;
    puStack_2b8 = (undefined1 *)0x15d6fb;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e38a;
    puStack_2b8 = (undefined1 *)0x15d715;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d729;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d747;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_42,run_test_idna_toascii::s_42 + 0x17,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x1f) goto LAB_0015e38f;
    auVar68[0] = -(cStack_2a1 == '3');
    auVar68[1] = -(cStack_2a0 == 'g');
    auVar68[2] = -(cStack_29f == 'u');
    auVar68[3] = -(cStack_29e == 'e');
    auVar68[4] = -(cStack_29d == '6');
    auVar68[5] = -(cStack_29c == 'q');
    auVar68[6] = -(cStack_29b == 'z');
    auVar68[7] = -(cStack_29a == '0');
    auVar68[8] = -(cStack_299 == '7');
    auVar68[9] = -(cStack_298 == '5');
    auVar68[10] = -(cStack_297 == 'a');
    auVar68[0xb] = -(cStack_296 == 'z');
    auVar68[0xc] = -(cStack_295 == 'm');
    auVar68[0xd] = -(cStack_294 == '5');
    auVar68[0xe] = -(cStack_293 == 'e');
    auVar68[0xf] = -(cStack_292 == '\0');
    auVar35[0] = -(acStack_2b0[0] == 'x');
    auVar35[1] = -(acStack_2b0[1] == 'n');
    auVar35[2] = -(acStack_2b0[2] == '-');
    auVar35[3] = -(acStack_2b0[3] == '-');
    auVar35[4] = -(cStack_2ac == 'M');
    auVar35[5] = -(cStack_2ab == 'a');
    auVar35[6] = -(cStack_2aa == 'j');
    auVar35[7] = -(cStack_2a9 == 'i');
    auVar35[8] = -(cStack_2a8 == 'K');
    auVar35[9] = -(cStack_2a7 == 'o');
    auVar35[10] = -(cStack_2a6 == 'i');
    auVar35[0xb] = -(cStack_2a5 == '5');
    auVar35[0xc] = -(cStack_2a4 == '-');
    auVar35[0xd] = -(cStack_2a3 == '7');
    auVar35[0xe] = -(cStack_2a2 == '8');
    auVar35[0xf] = -(cStack_2a1 == '3');
    auVar35 = auVar35 & auVar68;
    if ((ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) | (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar35[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e394;
    puStack_2b8 = (undefined1 *)0x15d78a;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15d7a6;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x1f) goto LAB_0015e399;
    auVar36[0] = -(cStack_1b0 == 'x');
    auVar36[1] = -(cStack_1af == 'n');
    auVar36[2] = -(cStack_1ae == '-');
    auVar36[3] = -(cStack_1ad == '-');
    auVar36[4] = -(cStack_1ac == 'M');
    auVar36[5] = -(cStack_1ab == 'a');
    auVar36[6] = -(cStack_1aa == 'j');
    auVar36[7] = -(cStack_1a9 == 'i');
    auVar36[8] = -(cStack_1a8 == 'K');
    auVar36[9] = -(cStack_1a7 == 'o');
    auVar36[10] = -(cStack_1a6 == 'i');
    auVar36[0xb] = -(cStack_1a5 == '5');
    auVar36[0xc] = -(cStack_1a4 == '-');
    auVar36[0xd] = -(cStack_1a3 == '7');
    auVar36[0xe] = -(cStack_1a2 == '8');
    auVar36[0xf] = -(cStack_1a1 == '3');
    auVar80[0] = -(cStack_1a1 == '3');
    auVar80[1] = -(cStack_1a0 == 'g');
    auVar80[2] = -(cStack_19f == 'u');
    auVar80[3] = -(cStack_19e == 'e');
    auVar80[4] = -(cStack_19d == '6');
    auVar80[5] = -(cStack_19c == 'q');
    auVar80[6] = -(cStack_19b == 'z');
    auVar80[7] = -(cStack_19a == '0');
    auVar80[8] = -(cStack_199 == '7');
    auVar80[9] = -(cStack_198 == '5');
    auVar80[10] = -(cStack_197 == 'a');
    auVar80[0xb] = -(cStack_196 == 'z');
    auVar80[0xc] = -(cStack_195 == 'm');
    auVar80[0xd] = -(cStack_194 == '5');
    auVar80[0xe] = -(cStack_193 == 'e');
    auVar80[0xf] = -(cStack_192 == '\0');
    auVar36 = auVar36 & auVar80;
    if ((ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) | (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar36[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e39e;
    puStack_2b8 = (undefined1 *)0x15d832;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e3a3;
    puStack_2b8 = (undefined1 *)0x15d84c;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d860;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d87e;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_43,run_test_idna_toascii::s_43 + 0x17,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x16) goto LAB_0015e3a8;
    auVar69[0] = -(cStack_2aa == '-');
    auVar69[1] = -(cStack_2a9 == 'j');
    auVar69[2] = -(cStack_2a8 == 'g');
    auVar69[3] = -(cStack_2a7 == '4');
    auVar69[4] = -(cStack_2a6 == 'a');
    auVar69[5] = -(cStack_2a5 == 'v');
    auVar69[6] = -(cStack_2a4 == 'h');
    auVar69[7] = -(cStack_2a3 == 'b');
    auVar69[8] = -(cStack_2a2 == 'y');
    auVar69[9] = -(cStack_2a1 == '1');
    auVar69[10] = -(cStack_2a0 == 'n');
    auVar69[0xb] = -(cStack_29f == 'o');
    auVar69[0xc] = -(cStack_29e == 'c');
    auVar69[0xd] = -(cStack_29d == '0');
    auVar69[0xe] = -(cStack_29c == 'd');
    auVar69[0xf] = -(cStack_29b == '\0');
    auVar37[0] = -(acStack_2b0[0] == 'x');
    auVar37[1] = -(acStack_2b0[1] == 'n');
    auVar37[2] = -(acStack_2b0[2] == '-');
    auVar37[3] = -(acStack_2b0[3] == '-');
    auVar37[4] = -(cStack_2ac == 'd');
    auVar37[5] = -(cStack_2ab == 'e');
    auVar37[6] = -(cStack_2aa == '-');
    auVar37[7] = -(cStack_2a9 == 'j');
    auVar37[8] = -(cStack_2a8 == 'g');
    auVar37[9] = -(cStack_2a7 == '4');
    auVar37[10] = -(cStack_2a6 == 'a');
    auVar37[0xb] = -(cStack_2a5 == 'v');
    auVar37[0xc] = -(cStack_2a4 == 'h');
    auVar37[0xd] = -(cStack_2a3 == 'b');
    auVar37[0xe] = -(cStack_2a2 == 'y');
    auVar37[0xf] = -(cStack_2a1 == '1');
    auVar37 = auVar37 & auVar69;
    if ((ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) | (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar37[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e3ad;
    puStack_2b8 = (undefined1 *)0x15d8c1;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15d8dd;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x16) goto LAB_0015e3b2;
    auVar38[0] = -(cStack_1b0 == 'x');
    auVar38[1] = -(cStack_1af == 'n');
    auVar38[2] = -(cStack_1ae == '-');
    auVar38[3] = -(cStack_1ad == '-');
    auVar38[4] = -(cStack_1ac == 'd');
    auVar38[5] = -(cStack_1ab == 'e');
    auVar38[6] = -(cStack_1aa == '-');
    auVar38[7] = -(cStack_1a9 == 'j');
    auVar38[8] = -(cStack_1a8 == 'g');
    auVar38[9] = -(cStack_1a7 == '4');
    auVar38[10] = -(cStack_1a6 == 'a');
    auVar38[0xb] = -(cStack_1a5 == 'v');
    auVar38[0xc] = -(cStack_1a4 == 'h');
    auVar38[0xd] = -(cStack_1a3 == 'b');
    auVar38[0xe] = -(cStack_1a2 == 'y');
    auVar38[0xf] = -(cStack_1a1 == '1');
    auVar81[0] = -(cStack_1aa == '-');
    auVar81[1] = -(cStack_1a9 == 'j');
    auVar81[2] = -(cStack_1a8 == 'g');
    auVar81[3] = -(cStack_1a7 == '4');
    auVar81[4] = -(cStack_1a6 == 'a');
    auVar81[5] = -(cStack_1a5 == 'v');
    auVar81[6] = -(cStack_1a4 == 'h');
    auVar81[7] = -(cStack_1a3 == 'b');
    auVar81[8] = -(cStack_1a2 == 'y');
    auVar81[9] = -(cStack_1a1 == '1');
    auVar81[10] = -(cStack_1a0 == 'n');
    auVar81[0xb] = -(cStack_19f == 'o');
    auVar81[0xc] = -(cStack_19e == 'c');
    auVar81[0xd] = -(cStack_19d == '0');
    auVar81[0xe] = -(cStack_19c == 'd');
    auVar81[0xf] = -(cStack_19b == '\0');
    auVar38 = auVar38 & auVar81;
    if ((ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) | (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar38[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e3b7;
    puStack_2b8 = (undefined1 *)0x15d969;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e3bc;
    puStack_2b8 = (undefined1 *)0x15d983;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d997;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d9b5;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_44,run_test_idna_toascii::s_44 + 0x15,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x14) goto LAB_0015e3c1;
    auVar70[0] = -(cStack_2a0 == 'c');
    auVar70[1] = -(cStack_29f == 'z');
    auVar70[2] = -(cStack_29e == 'p');
    auVar70[3] = -(cStack_29d == '\0');
    auVar70[4] = 0xff;
    auVar70[5] = 0xff;
    auVar70[6] = 0xff;
    auVar70[7] = 0xff;
    auVar70[8] = 0xff;
    auVar70[9] = 0xff;
    auVar70[10] = 0xff;
    auVar70[0xb] = 0xff;
    auVar70[0xc] = 0xff;
    auVar70[0xd] = 0xff;
    auVar70[0xe] = 0xff;
    auVar70[0xf] = 0xff;
    auVar39[0] = -(acStack_2b0[0] == 'x');
    auVar39[1] = -(acStack_2b0[1] == 'n');
    auVar39[2] = -(acStack_2b0[2] == '-');
    auVar39[3] = -(acStack_2b0[3] == '-');
    auVar39[4] = -(cStack_2ac == 'd');
    auVar39[5] = -(cStack_2ab == '9');
    auVar39[6] = -(cStack_2aa == 'j');
    auVar39[7] = -(cStack_2a9 == 'u');
    auVar39[8] = -(cStack_2a8 == 'a');
    auVar39[9] = -(cStack_2a7 == 'u');
    auVar39[10] = -(cStack_2a6 == '4');
    auVar39[0xb] = -(cStack_2a5 == '1');
    auVar39[0xc] = -(cStack_2a4 == 'a');
    auVar39[0xd] = -(cStack_2a3 == 'w');
    auVar39[0xe] = -(cStack_2a2 == 'c');
    auVar39[0xf] = -(cStack_2a1 == 'z');
    auVar39 = auVar39 & auVar70;
    if ((ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) | (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar39[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e3c6;
    puStack_2b8 = (undefined1 *)0x15d9f8;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15da14;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x14) goto LAB_0015e3cb;
    auVar40[0] = -(cStack_1b0 == 'x');
    auVar40[1] = -(cStack_1af == 'n');
    auVar40[2] = -(cStack_1ae == '-');
    auVar40[3] = -(cStack_1ad == '-');
    auVar40[4] = -(cStack_1ac == 'd');
    auVar40[5] = -(cStack_1ab == '9');
    auVar40[6] = -(cStack_1aa == 'j');
    auVar40[7] = -(cStack_1a9 == 'u');
    auVar40[8] = -(cStack_1a8 == 'a');
    auVar40[9] = -(cStack_1a7 == 'u');
    auVar40[10] = -(cStack_1a6 == '4');
    auVar40[0xb] = -(cStack_1a5 == '1');
    auVar40[0xc] = -(cStack_1a4 == 'a');
    auVar40[0xd] = -(cStack_1a3 == 'w');
    auVar40[0xe] = -(cStack_1a2 == 'c');
    auVar40[0xf] = -(cStack_1a1 == 'z');
    auVar71[0] = -(cStack_1a0 == 'c');
    auVar71[1] = -(cStack_19f == 'z');
    auVar71[2] = -(cStack_19e == 'p');
    auVar71[3] = -(cStack_19d == '\0');
    auVar71[4] = 0xff;
    auVar71[5] = 0xff;
    auVar71[6] = 0xff;
    auVar71[7] = 0xff;
    auVar71[8] = 0xff;
    auVar71[9] = 0xff;
    auVar71[10] = 0xff;
    auVar71[0xb] = 0xff;
    auVar71[0xc] = 0xff;
    auVar71[0xd] = 0xff;
    auVar71[0xe] = 0xff;
    auVar71[0xf] = 0xff;
    auVar71 = auVar71 & auVar40;
    if ((ushort)((ushort)(SUB161(auVar71 >> 7,0) & 1) | (ushort)(SUB161(auVar71 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar71 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar71 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar71 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar71 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar71 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar71 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar71 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar71 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar71 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar71 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar71 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar71 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar71 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar71[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e3d0;
    puStack_2b8 = (undefined1 *)0x15da82;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e3d5;
    puStack_2b8 = (undefined1 *)0x15da9c;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15dab0;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15dace;
    lVar4 = uv__idna_toascii("-> $1.00 <-","",acStack_2b0,&cStack_1b0);
    if (lVar4 != 0xc) goto LAB_0015e3da;
    if (CONCAT13(cStack_2a5,CONCAT12(cStack_2a6,CONCAT11(cStack_2a7,cStack_2a8))) != 0x2d3c20 ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x30302e3124203e2d)
    goto LAB_0015e3df;
    puStack_2b8 = (undefined1 *)0x15db08;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15db24;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0xc) goto LAB_0015e3e4;
    if (CONCAT13(cStack_1a5,CONCAT12(cStack_1a6,CONCAT11(cStack_1a7,cStack_1a8))) != 0x2d3c20 ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x30302e3124203e2d) goto LAB_0015e3e9;
    puStack_2b8 = (undefined1 *)0x15db61;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e3ee;
    puStack_2b8 = (undefined1 *)0x15db7b;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15db8f;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15dbad;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_46,run_test_idna_toascii::s_46 + 7,acStack_2b0
                             ,&cStack_1b0);
    if (lVar4 != 0xe) goto LAB_0015e3f3;
    if (CONCAT17(cStack_2a3,
                 CONCAT16(cStack_2a4,
                          CONCAT15(cStack_2a5,
                                   CONCAT14(cStack_2a6,
                                            CONCAT13(cStack_2a7,
                                                     CONCAT12(cStack_2a8,
                                                              CONCAT11(cStack_2a9,cStack_2aa)))))))
        != 0x65642e6169682d ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x682d61662d2d6e78)
    goto LAB_0015e3f8;
    puStack_2b8 = (undefined1 *)0x15dbee;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15dc0a;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0xe) goto LAB_0015e3fd;
    if (CONCAT17(cStack_1a3,
                 CONCAT16(cStack_1a4,
                          CONCAT15(cStack_1a5,
                                   CONCAT14(cStack_1a6,
                                            CONCAT13(cStack_1a7,
                                                     CONCAT12(cStack_1a8,
                                                              CONCAT11(cStack_1a9,cStack_1aa)))))))
        != 0x65642e6169682d ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x682d61662d2d6e78) goto LAB_0015e402;
    puStack_2b8 = (undefined1 *)0x15dc42;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e407;
    puStack_2b8 = (undefined1 *)0x15dc5c;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15dc70;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15dc8e;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_47,run_test_idna_toascii::s_47 + 0xe,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x11) goto LAB_0015e40c;
    if ((cStack_2a0 != '\0' ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x7361786e2d2d6e78)
        || CONCAT17(cStack_2a1,
                    CONCAT16(cStack_2a2,
                             CONCAT15(cStack_2a3,
                                      CONCAT14(cStack_2a4,
                                               CONCAT13(cStack_2a5,
                                                        CONCAT12(cStack_2a6,
                                                                 CONCAT11(cStack_2a7,cStack_2a8)))))
                            )) != 0x6d6f632e63316d6d) goto LAB_0015e411;
    puStack_2b8 = (undefined1 *)0x15dcd7;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15dcf3;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x11) goto LAB_0015e416;
    if ((cStack_1a0 != '\0' ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x7361786e2d2d6e78) ||
        CONCAT17(cStack_1a1,
                 CONCAT16(cStack_1a2,
                          CONCAT15(cStack_1a3,
                                   CONCAT14(cStack_1a4,
                                            CONCAT13(cStack_1a5,
                                                     CONCAT12(cStack_1a6,
                                                              CONCAT11(cStack_1a7,cStack_1a8)))))))
        != 0x6d6f632e63316d6d) goto LAB_0015e41b;
    puStack_2b8 = (undefined1 *)0x15dd36;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e420;
    puStack_2b8 = (undefined1 *)0x15dd50;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15dd64;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15dd82;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_48,run_test_idna_toascii::s_48 + 0x13,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x15) goto LAB_0015e425;
    auVar72[0] = -(cStack_2ab == '0');
    auVar72[1] = -(cStack_2aa == 'c');
    auVar72[2] = -(cStack_2a9 == 'l');
    auVar72[3] = -(cStack_2a8 == '1');
    auVar72[4] = -(cStack_2a7 == 'a');
    auVar72[5] = -(cStack_2a6 == '0');
    auVar72[6] = -(cStack_2a5 == 'b');
    auVar72[7] = -(cStack_2a4 == '6');
    auVar72[8] = -(cStack_2a3 == '6');
    auVar72[9] = -(cStack_2a2 == '0');
    auVar72[10] = -(cStack_2a1 == 'p');
    auVar72[0xb] = -(cStack_2a0 == '.');
    auVar72[0xc] = -(cStack_29f == 'c');
    auVar72[0xd] = -(cStack_29e == 'o');
    auVar72[0xe] = -(cStack_29d == 'm');
    auVar72[0xf] = -(cStack_29c == '\0');
    auVar41[0] = -(acStack_2b0[0] == 'x');
    auVar41[1] = -(acStack_2b0[1] == 'n');
    auVar41[2] = -(acStack_2b0[2] == '-');
    auVar41[3] = -(acStack_2b0[3] == '-');
    auVar41[4] = -(cStack_2ac == '1');
    auVar41[5] = -(cStack_2ab == '0');
    auVar41[6] = -(cStack_2aa == 'c');
    auVar41[7] = -(cStack_2a9 == 'l');
    auVar41[8] = -(cStack_2a8 == '1');
    auVar41[9] = -(cStack_2a7 == 'a');
    auVar41[10] = -(cStack_2a6 == '0');
    auVar41[0xb] = -(cStack_2a5 == 'b');
    auVar41[0xc] = -(cStack_2a4 == '6');
    auVar41[0xd] = -(cStack_2a3 == '6');
    auVar41[0xe] = -(cStack_2a2 == '0');
    auVar41[0xf] = -(cStack_2a1 == 'p');
    auVar41 = auVar41 & auVar72;
    if ((ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) | (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar41[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e42a;
    puStack_2b8 = (undefined1 *)0x15ddc5;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15dde1;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x15) goto LAB_0015e42f;
    auVar42[0] = -(cStack_1b0 == 'x');
    auVar42[1] = -(cStack_1af == 'n');
    auVar42[2] = -(cStack_1ae == '-');
    auVar42[3] = -(cStack_1ad == '-');
    auVar42[4] = -(cStack_1ac == '1');
    auVar42[5] = -(cStack_1ab == '0');
    auVar42[6] = -(cStack_1aa == 'c');
    auVar42[7] = -(cStack_1a9 == 'l');
    auVar42[8] = -(cStack_1a8 == '1');
    auVar42[9] = -(cStack_1a7 == 'a');
    auVar42[10] = -(cStack_1a6 == '0');
    auVar42[0xb] = -(cStack_1a5 == 'b');
    auVar42[0xc] = -(cStack_1a4 == '6');
    auVar42[0xd] = -(cStack_1a3 == '6');
    auVar42[0xe] = -(cStack_1a2 == '0');
    auVar42[0xf] = -(cStack_1a1 == 'p');
    auVar82[0] = -(cStack_1ab == '0');
    auVar82[1] = -(cStack_1aa == 'c');
    auVar82[2] = -(cStack_1a9 == 'l');
    auVar82[3] = -(cStack_1a8 == '1');
    auVar82[4] = -(cStack_1a7 == 'a');
    auVar82[5] = -(cStack_1a6 == '0');
    auVar82[6] = -(cStack_1a5 == 'b');
    auVar82[7] = -(cStack_1a4 == '6');
    auVar82[8] = -(cStack_1a3 == '6');
    auVar82[9] = -(cStack_1a2 == '0');
    auVar82[10] = -(cStack_1a1 == 'p');
    auVar82[0xb] = -(cStack_1a0 == '.');
    auVar82[0xc] = -(cStack_19f == 'c');
    auVar82[0xd] = -(cStack_19e == 'o');
    auVar82[0xe] = -(cStack_19d == 'm');
    auVar82[0xf] = -(cStack_19c == '\0');
    auVar42 = auVar42 & auVar82;
    if ((ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) | (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar42[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e434;
    puStack_2b8 = (undefined1 *)0x15de6d;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 != 0) goto LAB_0015e439;
    puStack_2b8 = (undefined1 *)0x15de87;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15de9b;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15deb9;
    lVar4 = uv__idna_toascii(run_test_idna_toascii::s_49,run_test_idna_toascii::s_49 + 0x13,
                             acStack_2b0,&cStack_1b0);
    if (lVar4 != 0x18) goto LAB_0015e43e;
    auVar73[0] = -(cStack_2a0 == '6');
    auVar73[1] = -(cStack_29f == '0');
    auVar73[2] = -(cStack_29e == 'k');
    auVar73[3] = -(cStack_29d == '.');
    auVar73[4] = -(cStack_29c == 'c');
    auVar73[5] = -(cStack_29b == 'o');
    auVar73[6] = -(cStack_29a == 'm');
    auVar73[7] = -(cStack_299 == '\0');
    auVar73[8] = 0xff;
    auVar73[9] = 0xff;
    auVar73[10] = 0xff;
    auVar73[0xb] = 0xff;
    auVar73[0xc] = 0xff;
    auVar73[0xd] = 0xff;
    auVar73[0xe] = 0xff;
    auVar73[0xf] = 0xff;
    auVar43[0] = -(acStack_2b0[0] == 'x');
    auVar43[1] = -(acStack_2b0[1] == 'n');
    auVar43[2] = -(acStack_2b0[2] == '-');
    auVar43[3] = -(acStack_2b0[3] == '-');
    auVar43[4] = -(cStack_2ac == 'm');
    auVar43[5] = -(cStack_2ab == 'g');
    auVar43[6] = -(cStack_2aa == 'b');
    auVar43[7] = -(cStack_2a9 == 'a');
    auVar43[8] = -(cStack_2a8 == '3');
    auVar43[9] = -(cStack_2a7 == 'g');
    auVar43[10] = -(cStack_2a6 == 'c');
    auVar43[0xb] = -(cStack_2a5 == 'h');
    auVar43[0xc] = -(cStack_2a4 == '3');
    auVar43[0xd] = -(cStack_2a3 == '1');
    auVar43[0xe] = -(cStack_2a2 == 'f');
    auVar43[0xf] = -(cStack_2a1 == '0');
    auVar43 = auVar43 & auVar73;
    if ((ushort)((ushort)(SUB161(auVar43 >> 7,0) & 1) | (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar43[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e443;
    puStack_2b8 = (undefined1 *)0x15defc;
    sVar5 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15df18;
    lVar4 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar5,&cStack_1b0,acStack_b0);
    if (lVar4 != 0x18) goto LAB_0015e448;
    auVar44[0] = -(cStack_1b0 == 'x');
    auVar44[1] = -(cStack_1af == 'n');
    auVar44[2] = -(cStack_1ae == '-');
    auVar44[3] = -(cStack_1ad == '-');
    auVar44[4] = -(cStack_1ac == 'm');
    auVar44[5] = -(cStack_1ab == 'g');
    auVar44[6] = -(cStack_1aa == 'b');
    auVar44[7] = -(cStack_1a9 == 'a');
    auVar44[8] = -(cStack_1a8 == '3');
    auVar44[9] = -(cStack_1a7 == 'g');
    auVar44[10] = -(cStack_1a6 == 'c');
    auVar44[0xb] = -(cStack_1a5 == 'h');
    auVar44[0xc] = -(cStack_1a4 == '3');
    auVar44[0xd] = -(cStack_1a3 == '1');
    auVar44[0xe] = -(cStack_1a2 == 'f');
    auVar44[0xf] = -(cStack_1a1 == '0');
    auVar74[0] = -(cStack_1a0 == '6');
    auVar74[1] = -(cStack_19f == '0');
    auVar74[2] = -(cStack_19e == 'k');
    auVar74[3] = -(cStack_19d == '.');
    auVar74[4] = -(cStack_19c == 'c');
    auVar74[5] = -(cStack_19b == 'o');
    auVar74[6] = -(cStack_19a == 'm');
    auVar74[7] = -(cStack_199 == '\0');
    auVar74[8] = 0xff;
    auVar74[9] = 0xff;
    auVar74[10] = 0xff;
    auVar74[0xb] = 0xff;
    auVar74[0xc] = 0xff;
    auVar74[0xd] = 0xff;
    auVar74[0xe] = 0xff;
    auVar74[0xf] = 0xff;
    auVar74 = auVar74 & auVar44;
    if ((ushort)((ushort)(SUB161(auVar74 >> 7,0) & 1) | (ushort)(SUB161(auVar74 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar74 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar74 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar74 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar74 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar74 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar74 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar74 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar74 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar74 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar74 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar74 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar74 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar74 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar74[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015e44d;
    puStack_2b8 = (undefined1 *)0x15df86;
    iVar3 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    puStack_2b8 = (undefined1 *)0x15dfa2;
    run_test_idna_toascii_cold_1();
LAB_0015dfa2:
    puStack_2b8 = (undefined1 *)0x15dfa7;
    run_test_idna_toascii_cold_2();
LAB_0015dfa7:
    puStack_2b8 = (undefined1 *)0x15dfac;
    run_test_idna_toascii_cold_3();
LAB_0015dfac:
    puStack_2b8 = (undefined1 *)0x15dfb1;
    run_test_idna_toascii_cold_4();
LAB_0015dfb1:
    puStack_2b8 = (undefined1 *)0x15dfb6;
    run_test_idna_toascii_cold_5();
LAB_0015dfb6:
    puStack_2b8 = (undefined1 *)0x15dfbb;
    run_test_idna_toascii_cold_6();
LAB_0015dfbb:
    puStack_2b8 = (undefined1 *)0x15dfc0;
    run_test_idna_toascii_cold_7();
LAB_0015dfc0:
    puStack_2b8 = (undefined1 *)0x15dfc5;
    run_test_idna_toascii_cold_8();
LAB_0015dfc5:
    puStack_2b8 = (undefined1 *)0x15dfca;
    run_test_idna_toascii_cold_9();
LAB_0015dfca:
    puStack_2b8 = (undefined1 *)0x15dfcf;
    run_test_idna_toascii_cold_10();
LAB_0015dfcf:
    puStack_2b8 = (undefined1 *)0x15dfd4;
    run_test_idna_toascii_cold_11();
LAB_0015dfd4:
    puStack_2b8 = (undefined1 *)0x15dfd9;
    run_test_idna_toascii_cold_12();
LAB_0015dfd9:
    puStack_2b8 = (undefined1 *)0x15dfde;
    run_test_idna_toascii_cold_13();
LAB_0015dfde:
    puStack_2b8 = (undefined1 *)0x15dfe3;
    run_test_idna_toascii_cold_14();
LAB_0015dfe3:
    puStack_2b8 = (undefined1 *)0x15dfe8;
    run_test_idna_toascii_cold_15();
LAB_0015dfe8:
    puStack_2b8 = (undefined1 *)0x15dfed;
    run_test_idna_toascii_cold_16();
LAB_0015dfed:
    puStack_2b8 = (undefined1 *)0x15dff2;
    run_test_idna_toascii_cold_17();
LAB_0015dff2:
    puStack_2b8 = (undefined1 *)0x15dff7;
    run_test_idna_toascii_cold_18();
LAB_0015dff7:
    puStack_2b8 = (undefined1 *)0x15dffc;
    run_test_idna_toascii_cold_19();
LAB_0015dffc:
    puStack_2b8 = (undefined1 *)0x15e001;
    run_test_idna_toascii_cold_20();
LAB_0015e001:
    puStack_2b8 = (undefined1 *)0x15e006;
    run_test_idna_toascii_cold_21();
LAB_0015e006:
    puStack_2b8 = (undefined1 *)0x15e00b;
    run_test_idna_toascii_cold_22();
LAB_0015e00b:
    puStack_2b8 = (undefined1 *)0x15e010;
    run_test_idna_toascii_cold_23();
LAB_0015e010:
    puStack_2b8 = (undefined1 *)0x15e015;
    run_test_idna_toascii_cold_24();
LAB_0015e015:
    puStack_2b8 = (undefined1 *)0x15e01a;
    run_test_idna_toascii_cold_25();
LAB_0015e01a:
    puStack_2b8 = (undefined1 *)0x15e01f;
    run_test_idna_toascii_cold_26();
LAB_0015e01f:
    puStack_2b8 = (undefined1 *)0x15e024;
    run_test_idna_toascii_cold_27();
LAB_0015e024:
    puStack_2b8 = (undefined1 *)0x15e029;
    run_test_idna_toascii_cold_28();
LAB_0015e029:
    puStack_2b8 = (undefined1 *)0x15e02e;
    run_test_idna_toascii_cold_29();
LAB_0015e02e:
    puStack_2b8 = (undefined1 *)0x15e033;
    run_test_idna_toascii_cold_30();
LAB_0015e033:
    puStack_2b8 = (undefined1 *)0x15e038;
    run_test_idna_toascii_cold_31();
LAB_0015e038:
    puStack_2b8 = (undefined1 *)0x15e03d;
    run_test_idna_toascii_cold_32();
LAB_0015e03d:
    puStack_2b8 = (undefined1 *)0x15e042;
    run_test_idna_toascii_cold_33();
LAB_0015e042:
    puStack_2b8 = (undefined1 *)0x15e047;
    run_test_idna_toascii_cold_34();
LAB_0015e047:
    puStack_2b8 = (undefined1 *)0x15e04c;
    run_test_idna_toascii_cold_35();
LAB_0015e04c:
    puStack_2b8 = (undefined1 *)0x15e051;
    run_test_idna_toascii_cold_36();
LAB_0015e051:
    puStack_2b8 = (undefined1 *)0x15e056;
    run_test_idna_toascii_cold_37();
LAB_0015e056:
    puStack_2b8 = (undefined1 *)0x15e05b;
    run_test_idna_toascii_cold_38();
LAB_0015e05b:
    puStack_2b8 = (undefined1 *)0x15e060;
    run_test_idna_toascii_cold_39();
LAB_0015e060:
    puStack_2b8 = (undefined1 *)0x15e065;
    run_test_idna_toascii_cold_40();
LAB_0015e065:
    puStack_2b8 = (undefined1 *)0x15e06a;
    run_test_idna_toascii_cold_41();
LAB_0015e06a:
    puStack_2b8 = (undefined1 *)0x15e06f;
    run_test_idna_toascii_cold_42();
LAB_0015e06f:
    puStack_2b8 = (undefined1 *)0x15e074;
    run_test_idna_toascii_cold_43();
LAB_0015e074:
    puStack_2b8 = (undefined1 *)0x15e079;
    run_test_idna_toascii_cold_44();
LAB_0015e079:
    puStack_2b8 = (undefined1 *)0x15e07e;
    run_test_idna_toascii_cold_45();
LAB_0015e07e:
    puStack_2b8 = (undefined1 *)0x15e083;
    run_test_idna_toascii_cold_46();
LAB_0015e083:
    puStack_2b8 = (undefined1 *)0x15e088;
    run_test_idna_toascii_cold_47();
LAB_0015e088:
    puStack_2b8 = (undefined1 *)0x15e08d;
    run_test_idna_toascii_cold_48();
LAB_0015e08d:
    puStack_2b8 = (undefined1 *)0x15e092;
    run_test_idna_toascii_cold_49();
LAB_0015e092:
    puStack_2b8 = (undefined1 *)0x15e097;
    run_test_idna_toascii_cold_50();
LAB_0015e097:
    puStack_2b8 = (undefined1 *)0x15e09c;
    run_test_idna_toascii_cold_51();
LAB_0015e09c:
    puStack_2b8 = (undefined1 *)0x15e0a1;
    run_test_idna_toascii_cold_52();
LAB_0015e0a1:
    puStack_2b8 = (undefined1 *)0x15e0a6;
    run_test_idna_toascii_cold_53();
LAB_0015e0a6:
    puStack_2b8 = (undefined1 *)0x15e0ab;
    run_test_idna_toascii_cold_54();
LAB_0015e0ab:
    puStack_2b8 = (undefined1 *)0x15e0b0;
    run_test_idna_toascii_cold_55();
LAB_0015e0b0:
    puStack_2b8 = (undefined1 *)0x15e0b5;
    run_test_idna_toascii_cold_56();
LAB_0015e0b5:
    puStack_2b8 = (undefined1 *)0x15e0ba;
    run_test_idna_toascii_cold_57();
LAB_0015e0ba:
    puStack_2b8 = (undefined1 *)0x15e0bf;
    run_test_idna_toascii_cold_58();
LAB_0015e0bf:
    puStack_2b8 = (undefined1 *)0x15e0c4;
    run_test_idna_toascii_cold_59();
LAB_0015e0c4:
    puStack_2b8 = (undefined1 *)0x15e0c9;
    run_test_idna_toascii_cold_60();
LAB_0015e0c9:
    puStack_2b8 = (undefined1 *)0x15e0ce;
    run_test_idna_toascii_cold_61();
LAB_0015e0ce:
    puStack_2b8 = (undefined1 *)0x15e0d3;
    run_test_idna_toascii_cold_62();
LAB_0015e0d3:
    puStack_2b8 = (undefined1 *)0x15e0d8;
    run_test_idna_toascii_cold_63();
LAB_0015e0d8:
    puStack_2b8 = (undefined1 *)0x15e0dd;
    run_test_idna_toascii_cold_64();
LAB_0015e0dd:
    puStack_2b8 = (undefined1 *)0x15e0e2;
    run_test_idna_toascii_cold_65();
LAB_0015e0e2:
    puStack_2b8 = (undefined1 *)0x15e0e7;
    run_test_idna_toascii_cold_66();
LAB_0015e0e7:
    puStack_2b8 = (undefined1 *)0x15e0ec;
    run_test_idna_toascii_cold_67();
LAB_0015e0ec:
    puStack_2b8 = (undefined1 *)0x15e0f1;
    run_test_idna_toascii_cold_68();
LAB_0015e0f1:
    puStack_2b8 = (undefined1 *)0x15e0f6;
    run_test_idna_toascii_cold_69();
LAB_0015e0f6:
    puStack_2b8 = (undefined1 *)0x15e0fb;
    run_test_idna_toascii_cold_70();
LAB_0015e0fb:
    puStack_2b8 = (undefined1 *)0x15e100;
    run_test_idna_toascii_cold_71();
LAB_0015e100:
    puStack_2b8 = (undefined1 *)0x15e105;
    run_test_idna_toascii_cold_72();
LAB_0015e105:
    puStack_2b8 = (undefined1 *)0x15e10a;
    run_test_idna_toascii_cold_73();
LAB_0015e10a:
    puStack_2b8 = (undefined1 *)0x15e10f;
    run_test_idna_toascii_cold_74();
LAB_0015e10f:
    puStack_2b8 = (undefined1 *)0x15e114;
    run_test_idna_toascii_cold_75();
LAB_0015e114:
    puStack_2b8 = (undefined1 *)0x15e119;
    run_test_idna_toascii_cold_76();
LAB_0015e119:
    puStack_2b8 = (undefined1 *)0x15e11e;
    run_test_idna_toascii_cold_77();
LAB_0015e11e:
    puStack_2b8 = (undefined1 *)0x15e123;
    run_test_idna_toascii_cold_78();
LAB_0015e123:
    puStack_2b8 = (undefined1 *)0x15e128;
    run_test_idna_toascii_cold_79();
LAB_0015e128:
    puStack_2b8 = (undefined1 *)0x15e12d;
    run_test_idna_toascii_cold_80();
LAB_0015e12d:
    puStack_2b8 = (undefined1 *)0x15e132;
    run_test_idna_toascii_cold_81();
LAB_0015e132:
    puStack_2b8 = (undefined1 *)0x15e137;
    run_test_idna_toascii_cold_82();
LAB_0015e137:
    puStack_2b8 = (undefined1 *)0x15e13c;
    run_test_idna_toascii_cold_83();
LAB_0015e13c:
    puStack_2b8 = (undefined1 *)0x15e141;
    run_test_idna_toascii_cold_84();
LAB_0015e141:
    puStack_2b8 = (undefined1 *)0x15e146;
    run_test_idna_toascii_cold_85();
LAB_0015e146:
    puStack_2b8 = (undefined1 *)0x15e14b;
    run_test_idna_toascii_cold_86();
LAB_0015e14b:
    puStack_2b8 = (undefined1 *)0x15e150;
    run_test_idna_toascii_cold_87();
LAB_0015e150:
    puStack_2b8 = (undefined1 *)0x15e155;
    run_test_idna_toascii_cold_88();
LAB_0015e155:
    puStack_2b8 = (undefined1 *)0x15e15a;
    run_test_idna_toascii_cold_89();
LAB_0015e15a:
    puStack_2b8 = (undefined1 *)0x15e15f;
    run_test_idna_toascii_cold_90();
LAB_0015e15f:
    puStack_2b8 = (undefined1 *)0x15e164;
    run_test_idna_toascii_cold_91();
LAB_0015e164:
    puStack_2b8 = (undefined1 *)0x15e169;
    run_test_idna_toascii_cold_92();
LAB_0015e169:
    puStack_2b8 = (undefined1 *)0x15e16e;
    run_test_idna_toascii_cold_93();
LAB_0015e16e:
    puStack_2b8 = (undefined1 *)0x15e173;
    run_test_idna_toascii_cold_94();
LAB_0015e173:
    puStack_2b8 = (undefined1 *)0x15e178;
    run_test_idna_toascii_cold_95();
LAB_0015e178:
    puStack_2b8 = (undefined1 *)0x15e17d;
    run_test_idna_toascii_cold_96();
LAB_0015e17d:
    puStack_2b8 = (undefined1 *)0x15e182;
    run_test_idna_toascii_cold_97();
LAB_0015e182:
    puStack_2b8 = (undefined1 *)0x15e187;
    run_test_idna_toascii_cold_98();
LAB_0015e187:
    puStack_2b8 = (undefined1 *)0x15e18c;
    run_test_idna_toascii_cold_99();
LAB_0015e18c:
    puStack_2b8 = (undefined1 *)0x15e191;
    run_test_idna_toascii_cold_100();
LAB_0015e191:
    puStack_2b8 = (undefined1 *)0x15e196;
    run_test_idna_toascii_cold_101();
LAB_0015e196:
    puStack_2b8 = (undefined1 *)0x15e19b;
    run_test_idna_toascii_cold_102();
LAB_0015e19b:
    puStack_2b8 = (undefined1 *)0x15e1a0;
    run_test_idna_toascii_cold_103();
LAB_0015e1a0:
    puStack_2b8 = (undefined1 *)0x15e1a5;
    run_test_idna_toascii_cold_104();
LAB_0015e1a5:
    puStack_2b8 = (undefined1 *)0x15e1aa;
    run_test_idna_toascii_cold_105();
LAB_0015e1aa:
    puStack_2b8 = (undefined1 *)0x15e1af;
    run_test_idna_toascii_cold_106();
LAB_0015e1af:
    puStack_2b8 = (undefined1 *)0x15e1b4;
    run_test_idna_toascii_cold_107();
LAB_0015e1b4:
    puStack_2b8 = (undefined1 *)0x15e1b9;
    run_test_idna_toascii_cold_108();
LAB_0015e1b9:
    puStack_2b8 = (undefined1 *)0x15e1be;
    run_test_idna_toascii_cold_109();
LAB_0015e1be:
    puStack_2b8 = (undefined1 *)0x15e1c3;
    run_test_idna_toascii_cold_110();
LAB_0015e1c3:
    puStack_2b8 = (undefined1 *)0x15e1c8;
    run_test_idna_toascii_cold_111();
LAB_0015e1c8:
    puStack_2b8 = (undefined1 *)0x15e1cd;
    run_test_idna_toascii_cold_112();
LAB_0015e1cd:
    puStack_2b8 = (undefined1 *)0x15e1d2;
    run_test_idna_toascii_cold_113();
LAB_0015e1d2:
    puStack_2b8 = (undefined1 *)0x15e1d7;
    run_test_idna_toascii_cold_114();
LAB_0015e1d7:
    puStack_2b8 = (undefined1 *)0x15e1dc;
    run_test_idna_toascii_cold_115();
LAB_0015e1dc:
    puStack_2b8 = (undefined1 *)0x15e1e1;
    run_test_idna_toascii_cold_116();
LAB_0015e1e1:
    puStack_2b8 = (undefined1 *)0x15e1e6;
    run_test_idna_toascii_cold_117();
LAB_0015e1e6:
    puStack_2b8 = (undefined1 *)0x15e1eb;
    run_test_idna_toascii_cold_118();
LAB_0015e1eb:
    puStack_2b8 = (undefined1 *)0x15e1f0;
    run_test_idna_toascii_cold_119();
LAB_0015e1f0:
    puStack_2b8 = (undefined1 *)0x15e1f5;
    run_test_idna_toascii_cold_120();
LAB_0015e1f5:
    puStack_2b8 = (undefined1 *)0x15e1fa;
    run_test_idna_toascii_cold_121();
LAB_0015e1fa:
    puStack_2b8 = (undefined1 *)0x15e1ff;
    run_test_idna_toascii_cold_122();
LAB_0015e1ff:
    puStack_2b8 = (undefined1 *)0x15e204;
    run_test_idna_toascii_cold_123();
LAB_0015e204:
    puStack_2b8 = (undefined1 *)0x15e209;
    run_test_idna_toascii_cold_124();
LAB_0015e209:
    puStack_2b8 = (undefined1 *)0x15e20e;
    run_test_idna_toascii_cold_125();
LAB_0015e20e:
    puStack_2b8 = (undefined1 *)0x15e213;
    run_test_idna_toascii_cold_126();
LAB_0015e213:
    puStack_2b8 = (undefined1 *)0x15e218;
    run_test_idna_toascii_cold_127();
LAB_0015e218:
    puStack_2b8 = (undefined1 *)0x15e21d;
    run_test_idna_toascii_cold_128();
LAB_0015e21d:
    puStack_2b8 = (undefined1 *)0x15e222;
    run_test_idna_toascii_cold_129();
LAB_0015e222:
    puStack_2b8 = (undefined1 *)0x15e227;
    run_test_idna_toascii_cold_130();
LAB_0015e227:
    puStack_2b8 = (undefined1 *)0x15e22c;
    run_test_idna_toascii_cold_131();
LAB_0015e22c:
    puStack_2b8 = (undefined1 *)0x15e231;
    run_test_idna_toascii_cold_132();
LAB_0015e231:
    puStack_2b8 = (undefined1 *)0x15e236;
    run_test_idna_toascii_cold_133();
LAB_0015e236:
    puStack_2b8 = (undefined1 *)0x15e23b;
    run_test_idna_toascii_cold_134();
LAB_0015e23b:
    puStack_2b8 = (undefined1 *)0x15e240;
    run_test_idna_toascii_cold_135();
LAB_0015e240:
    puStack_2b8 = (undefined1 *)0x15e245;
    run_test_idna_toascii_cold_136();
LAB_0015e245:
    puStack_2b8 = (undefined1 *)0x15e24a;
    run_test_idna_toascii_cold_137();
LAB_0015e24a:
    puStack_2b8 = (undefined1 *)0x15e24f;
    run_test_idna_toascii_cold_138();
LAB_0015e24f:
    puStack_2b8 = (undefined1 *)0x15e254;
    run_test_idna_toascii_cold_139();
LAB_0015e254:
    puStack_2b8 = (undefined1 *)0x15e259;
    run_test_idna_toascii_cold_140();
LAB_0015e259:
    puStack_2b8 = (undefined1 *)0x15e25e;
    run_test_idna_toascii_cold_141();
LAB_0015e25e:
    puStack_2b8 = (undefined1 *)0x15e263;
    run_test_idna_toascii_cold_142();
LAB_0015e263:
    puStack_2b8 = (undefined1 *)0x15e268;
    run_test_idna_toascii_cold_143();
LAB_0015e268:
    puStack_2b8 = (undefined1 *)0x15e26d;
    run_test_idna_toascii_cold_144();
LAB_0015e26d:
    puStack_2b8 = (undefined1 *)0x15e272;
    run_test_idna_toascii_cold_145();
LAB_0015e272:
    puStack_2b8 = (undefined1 *)0x15e277;
    run_test_idna_toascii_cold_146();
LAB_0015e277:
    puStack_2b8 = (undefined1 *)0x15e27c;
    run_test_idna_toascii_cold_147();
LAB_0015e27c:
    puStack_2b8 = (undefined1 *)0x15e281;
    run_test_idna_toascii_cold_148();
LAB_0015e281:
    puStack_2b8 = (undefined1 *)0x15e286;
    run_test_idna_toascii_cold_149();
LAB_0015e286:
    puStack_2b8 = (undefined1 *)0x15e28b;
    run_test_idna_toascii_cold_150();
LAB_0015e28b:
    puStack_2b8 = (undefined1 *)0x15e290;
    run_test_idna_toascii_cold_151();
LAB_0015e290:
    puStack_2b8 = (undefined1 *)0x15e295;
    run_test_idna_toascii_cold_152();
LAB_0015e295:
    puStack_2b8 = (undefined1 *)0x15e29a;
    run_test_idna_toascii_cold_153();
LAB_0015e29a:
    puStack_2b8 = (undefined1 *)0x15e29f;
    run_test_idna_toascii_cold_154();
LAB_0015e29f:
    puStack_2b8 = (undefined1 *)0x15e2a4;
    run_test_idna_toascii_cold_155();
LAB_0015e2a4:
    puStack_2b8 = (undefined1 *)0x15e2a9;
    run_test_idna_toascii_cold_156();
LAB_0015e2a9:
    puStack_2b8 = (undefined1 *)0x15e2ae;
    run_test_idna_toascii_cold_157();
LAB_0015e2ae:
    puStack_2b8 = (undefined1 *)0x15e2b3;
    run_test_idna_toascii_cold_158();
LAB_0015e2b3:
    puStack_2b8 = (undefined1 *)0x15e2b8;
    run_test_idna_toascii_cold_159();
LAB_0015e2b8:
    puStack_2b8 = (undefined1 *)0x15e2bd;
    run_test_idna_toascii_cold_160();
LAB_0015e2bd:
    puStack_2b8 = (undefined1 *)0x15e2c2;
    run_test_idna_toascii_cold_161();
LAB_0015e2c2:
    puStack_2b8 = (undefined1 *)0x15e2c7;
    run_test_idna_toascii_cold_162();
LAB_0015e2c7:
    puStack_2b8 = (undefined1 *)0x15e2cc;
    run_test_idna_toascii_cold_163();
LAB_0015e2cc:
    puStack_2b8 = (undefined1 *)0x15e2d1;
    run_test_idna_toascii_cold_164();
LAB_0015e2d1:
    puStack_2b8 = (undefined1 *)0x15e2d6;
    run_test_idna_toascii_cold_165();
LAB_0015e2d6:
    puStack_2b8 = (undefined1 *)0x15e2db;
    run_test_idna_toascii_cold_166();
LAB_0015e2db:
    puStack_2b8 = (undefined1 *)0x15e2e0;
    run_test_idna_toascii_cold_167();
LAB_0015e2e0:
    puStack_2b8 = (undefined1 *)0x15e2e5;
    run_test_idna_toascii_cold_168();
LAB_0015e2e5:
    puStack_2b8 = (undefined1 *)0x15e2ea;
    run_test_idna_toascii_cold_169();
LAB_0015e2ea:
    puStack_2b8 = (undefined1 *)0x15e2ef;
    run_test_idna_toascii_cold_170();
LAB_0015e2ef:
    puStack_2b8 = (undefined1 *)0x15e2f4;
    run_test_idna_toascii_cold_171();
LAB_0015e2f4:
    puStack_2b8 = (undefined1 *)0x15e2f9;
    run_test_idna_toascii_cold_172();
LAB_0015e2f9:
    puStack_2b8 = (undefined1 *)0x15e2fe;
    run_test_idna_toascii_cold_173();
LAB_0015e2fe:
    puStack_2b8 = (undefined1 *)0x15e303;
    run_test_idna_toascii_cold_174();
LAB_0015e303:
    puStack_2b8 = (undefined1 *)0x15e308;
    run_test_idna_toascii_cold_175();
LAB_0015e308:
    puStack_2b8 = (undefined1 *)0x15e30d;
    run_test_idna_toascii_cold_176();
LAB_0015e30d:
    puStack_2b8 = (undefined1 *)0x15e312;
    run_test_idna_toascii_cold_177();
LAB_0015e312:
    puStack_2b8 = (undefined1 *)0x15e317;
    run_test_idna_toascii_cold_178();
LAB_0015e317:
    puStack_2b8 = (undefined1 *)0x15e31c;
    run_test_idna_toascii_cold_179();
LAB_0015e31c:
    puStack_2b8 = (undefined1 *)0x15e321;
    run_test_idna_toascii_cold_180();
LAB_0015e321:
    puStack_2b8 = (undefined1 *)0x15e326;
    run_test_idna_toascii_cold_181();
LAB_0015e326:
    puStack_2b8 = (undefined1 *)0x15e32b;
    run_test_idna_toascii_cold_182();
LAB_0015e32b:
    puStack_2b8 = (undefined1 *)0x15e330;
    run_test_idna_toascii_cold_183();
LAB_0015e330:
    puStack_2b8 = (undefined1 *)0x15e335;
    run_test_idna_toascii_cold_184();
LAB_0015e335:
    puStack_2b8 = (undefined1 *)0x15e33a;
    run_test_idna_toascii_cold_185();
LAB_0015e33a:
    puStack_2b8 = (undefined1 *)0x15e33f;
    run_test_idna_toascii_cold_186();
LAB_0015e33f:
    puStack_2b8 = (undefined1 *)0x15e344;
    run_test_idna_toascii_cold_187();
LAB_0015e344:
    puStack_2b8 = (undefined1 *)0x15e349;
    run_test_idna_toascii_cold_188();
LAB_0015e349:
    puStack_2b8 = (undefined1 *)0x15e34e;
    run_test_idna_toascii_cold_189();
LAB_0015e34e:
    puStack_2b8 = (undefined1 *)0x15e353;
    run_test_idna_toascii_cold_190();
LAB_0015e353:
    puStack_2b8 = (undefined1 *)0x15e358;
    run_test_idna_toascii_cold_191();
LAB_0015e358:
    puStack_2b8 = (undefined1 *)0x15e35d;
    run_test_idna_toascii_cold_192();
LAB_0015e35d:
    puStack_2b8 = (undefined1 *)0x15e362;
    run_test_idna_toascii_cold_193();
LAB_0015e362:
    puStack_2b8 = (undefined1 *)0x15e367;
    run_test_idna_toascii_cold_194();
LAB_0015e367:
    puStack_2b8 = (undefined1 *)0x15e36c;
    run_test_idna_toascii_cold_195();
LAB_0015e36c:
    puStack_2b8 = (undefined1 *)0x15e371;
    run_test_idna_toascii_cold_196();
LAB_0015e371:
    puStack_2b8 = (undefined1 *)0x15e376;
    run_test_idna_toascii_cold_197();
LAB_0015e376:
    puStack_2b8 = (undefined1 *)0x15e37b;
    run_test_idna_toascii_cold_198();
LAB_0015e37b:
    puStack_2b8 = (undefined1 *)0x15e380;
    run_test_idna_toascii_cold_199();
LAB_0015e380:
    puStack_2b8 = (undefined1 *)0x15e385;
    run_test_idna_toascii_cold_200();
LAB_0015e385:
    puStack_2b8 = (undefined1 *)0x15e38a;
    run_test_idna_toascii_cold_201();
LAB_0015e38a:
    puStack_2b8 = (undefined1 *)0x15e38f;
    run_test_idna_toascii_cold_202();
LAB_0015e38f:
    puStack_2b8 = (undefined1 *)0x15e394;
    run_test_idna_toascii_cold_203();
LAB_0015e394:
    puStack_2b8 = (undefined1 *)0x15e399;
    run_test_idna_toascii_cold_204();
LAB_0015e399:
    puStack_2b8 = (undefined1 *)0x15e39e;
    run_test_idna_toascii_cold_205();
LAB_0015e39e:
    puStack_2b8 = (undefined1 *)0x15e3a3;
    run_test_idna_toascii_cold_206();
LAB_0015e3a3:
    puStack_2b8 = (undefined1 *)0x15e3a8;
    run_test_idna_toascii_cold_207();
LAB_0015e3a8:
    puStack_2b8 = (undefined1 *)0x15e3ad;
    run_test_idna_toascii_cold_208();
LAB_0015e3ad:
    puStack_2b8 = (undefined1 *)0x15e3b2;
    run_test_idna_toascii_cold_209();
LAB_0015e3b2:
    puStack_2b8 = (undefined1 *)0x15e3b7;
    run_test_idna_toascii_cold_210();
LAB_0015e3b7:
    puStack_2b8 = (undefined1 *)0x15e3bc;
    run_test_idna_toascii_cold_211();
LAB_0015e3bc:
    puStack_2b8 = (undefined1 *)0x15e3c1;
    run_test_idna_toascii_cold_212();
LAB_0015e3c1:
    puStack_2b8 = (undefined1 *)0x15e3c6;
    run_test_idna_toascii_cold_213();
LAB_0015e3c6:
    puStack_2b8 = (undefined1 *)0x15e3cb;
    run_test_idna_toascii_cold_214();
LAB_0015e3cb:
    puStack_2b8 = (undefined1 *)0x15e3d0;
    run_test_idna_toascii_cold_215();
LAB_0015e3d0:
    puStack_2b8 = (undefined1 *)0x15e3d5;
    run_test_idna_toascii_cold_216();
LAB_0015e3d5:
    puStack_2b8 = (undefined1 *)0x15e3da;
    run_test_idna_toascii_cold_217();
LAB_0015e3da:
    puStack_2b8 = (undefined1 *)0x15e3df;
    run_test_idna_toascii_cold_218();
LAB_0015e3df:
    puStack_2b8 = (undefined1 *)0x15e3e4;
    run_test_idna_toascii_cold_219();
LAB_0015e3e4:
    puStack_2b8 = (undefined1 *)0x15e3e9;
    run_test_idna_toascii_cold_220();
LAB_0015e3e9:
    puStack_2b8 = (undefined1 *)0x15e3ee;
    run_test_idna_toascii_cold_221();
LAB_0015e3ee:
    puStack_2b8 = (undefined1 *)0x15e3f3;
    run_test_idna_toascii_cold_222();
LAB_0015e3f3:
    puStack_2b8 = (undefined1 *)0x15e3f8;
    run_test_idna_toascii_cold_223();
LAB_0015e3f8:
    puStack_2b8 = (undefined1 *)0x15e3fd;
    run_test_idna_toascii_cold_224();
LAB_0015e3fd:
    puStack_2b8 = (undefined1 *)0x15e402;
    run_test_idna_toascii_cold_225();
LAB_0015e402:
    puStack_2b8 = (undefined1 *)0x15e407;
    run_test_idna_toascii_cold_226();
LAB_0015e407:
    puStack_2b8 = (undefined1 *)0x15e40c;
    run_test_idna_toascii_cold_227();
LAB_0015e40c:
    puStack_2b8 = (undefined1 *)0x15e411;
    run_test_idna_toascii_cold_228();
LAB_0015e411:
    puStack_2b8 = (undefined1 *)0x15e416;
    run_test_idna_toascii_cold_229();
LAB_0015e416:
    puStack_2b8 = (undefined1 *)0x15e41b;
    run_test_idna_toascii_cold_230();
LAB_0015e41b:
    puStack_2b8 = (undefined1 *)0x15e420;
    run_test_idna_toascii_cold_231();
LAB_0015e420:
    puStack_2b8 = (undefined1 *)0x15e425;
    run_test_idna_toascii_cold_232();
LAB_0015e425:
    puStack_2b8 = (undefined1 *)0x15e42a;
    run_test_idna_toascii_cold_233();
LAB_0015e42a:
    puStack_2b8 = (undefined1 *)0x15e42f;
    run_test_idna_toascii_cold_234();
LAB_0015e42f:
    puStack_2b8 = (undefined1 *)0x15e434;
    run_test_idna_toascii_cold_235();
LAB_0015e434:
    puStack_2b8 = (undefined1 *)0x15e439;
    run_test_idna_toascii_cold_236();
LAB_0015e439:
    puStack_2b8 = (undefined1 *)0x15e43e;
    run_test_idna_toascii_cold_237();
LAB_0015e43e:
    puStack_2b8 = (undefined1 *)0x15e443;
    run_test_idna_toascii_cold_238();
LAB_0015e443:
    puStack_2b8 = (undefined1 *)0x15e448;
    run_test_idna_toascii_cold_239();
LAB_0015e448:
    puStack_2b8 = (undefined1 *)0x15e44d;
    run_test_idna_toascii_cold_240();
LAB_0015e44d:
    puStack_2b8 = (undefined1 *)0x15e452;
    run_test_idna_toascii_cold_241();
  }
  puStack_2b8 = (undefined1 *)0x15e457;
  run_test_idna_toascii_cold_242();
  loop_00 = (char *)0x2;
  puStack_2b8 = acStack_2b0;
  iVar3 = uv_inet_ntop(2,anon_var_dwarf_3ccec,&cStack_2c8,0x10);
  if (iVar3 == 0) {
    auVar45[0] = -(cStack_2c8 == '2');
    auVar45[1] = -(cStack_2c7 == '5');
    auVar45[2] = -(cStack_2c6 == '5');
    auVar45[3] = -(cStack_2c5 == '.');
    auVar45[4] = -(cStack_2c4 == '2');
    auVar45[5] = -(cStack_2c3 == '5');
    auVar45[6] = -(cStack_2c2 == '5');
    auVar45[7] = -(cStack_2c1 == '.');
    auVar45[8] = -(cStack_2c0 == '2');
    auVar45[9] = -(cStack_2bf == '5');
    auVar45[10] = -(cStack_2be == '5');
    auVar45[0xb] = -(cStack_2bd == '.');
    auVar45[0xc] = -(cStack_2bc == '2');
    auVar45[0xd] = -(cStack_2bb == '5');
    auVar45[0xe] = -(cStack_2ba == '5');
    auVar45[0xf] = -(cStack_2b9 == '\0');
    if ((ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) | (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe | (ushort)(auVar45[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_0015e5c5;
    loop_00 = (char *)0x2;
    iVar3 = uv_inet_ntop(2,anon_var_dwarf_3ccec,&cStack_2c8,0xf);
    if (iVar3 != -0x1c) goto LAB_0015e5ca;
    loop_00 = "127.0.0.1";
    iVar3 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_2d8);
    if (iVar3 != 0) goto LAB_0015e5cf;
    loop_00 = "255.255.255.255";
    iVar3 = uv_ip4_addr("255.255.255.255",0x23a3,&sStack_2d8);
    if (iVar3 != 0) goto LAB_0015e5d4;
    loop_00 = "255.255.255*000";
    iVar3 = uv_ip4_addr("255.255.255*000",0x23a3,&sStack_2d8);
    if (iVar3 != -0x16) goto LAB_0015e5d9;
    loop_00 = "255.255.255.256";
    iVar3 = uv_ip4_addr("255.255.255.256",0x23a3,&sStack_2d8);
    if (iVar3 != -0x16) goto LAB_0015e5de;
    loop_00 = "2555.0.0.0";
    iVar3 = uv_ip4_addr("2555.0.0.0",0x23a3,&sStack_2d8);
    if (iVar3 != -0x16) goto LAB_0015e5e3;
    loop_00 = "255";
    iVar3 = uv_ip4_addr("255",0x23a3,&sStack_2d8);
    if (iVar3 != -0x16) goto LAB_0015e5e8;
    loop_00 = (char *)0x2a;
    iVar3 = uv_inet_pton(0x2a,"127.0.0.1",&sStack_2d8.sin_addr);
    if (iVar3 == -0x61) {
      loop = uv_default_loop();
      uv_walk(loop,close_walk_cb,(void *)0x0);
      uv_run(loop,UV_RUN_DEFAULT);
      loop_00 = (char *)uv_default_loop();
      iVar3 = uv_loop_close((uv_loop_t *)loop_00);
      if (iVar3 == 0) {
        return 0;
      }
      goto LAB_0015e5f2;
    }
  }
  else {
    run_test_ip4_addr_cold_1();
LAB_0015e5c5:
    run_test_ip4_addr_cold_2();
LAB_0015e5ca:
    run_test_ip4_addr_cold_3();
LAB_0015e5cf:
    run_test_ip4_addr_cold_4();
LAB_0015e5d4:
    run_test_ip4_addr_cold_5();
LAB_0015e5d9:
    run_test_ip4_addr_cold_6();
LAB_0015e5de:
    run_test_ip4_addr_cold_7();
LAB_0015e5e3:
    run_test_ip4_addr_cold_8();
LAB_0015e5e8:
    run_test_ip4_addr_cold_9();
  }
  run_test_ip4_addr_cold_10();
LAB_0015e5f2:
  run_test_ip4_addr_cold_11();
  iVar3 = uv_is_closing((uv_handle_t *)loop_00);
  if (iVar3 != 0) {
    return iVar3;
  }
  uv_close((uv_handle_t *)loop_00,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(utf8_decode1) {
  const char* p;
  char b[32];
  int i;

  /* ASCII. */
  p = b;
  snprintf(b, sizeof(b), "%c\x7F", 0x00);
  ASSERT(0 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 1);
  ASSERT(127 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 2);

  /* Two-byte sequences. */
  p = b;
  snprintf(b, sizeof(b), "\xC2\x80\xDF\xBF");
  ASSERT(128 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 2);
  ASSERT(0x7FF == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 4);

  /* Three-byte sequences. */
  p = b;
  snprintf(b, sizeof(b), "\xE0\xA0\x80\xEF\xBF\xBF");
  ASSERT(0x800 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 3);
  ASSERT(0xFFFF == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 6);

  /* Four-byte sequences. */
  p = b;
  snprintf(b, sizeof(b), "\xF0\x90\x80\x80\xF4\x8F\xBF\xBF");
  ASSERT(0x10000 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 4);
  ASSERT(0x10FFFF == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 8);

  /* Four-byte sequences > U+10FFFF; disallowed. */
  p = b;
  snprintf(b, sizeof(b), "\xF4\x90\xC0\xC0\xF7\xBF\xBF\xBF");
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 4);
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 8);

  /* Overlong; disallowed. */
  p = b;
  snprintf(b, sizeof(b), "\xC0\x80\xC1\x80");
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 2);
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 4);

  /* Surrogate pairs; disallowed. */
  p = b;
  snprintf(b, sizeof(b), "\xED\xA0\x80\xED\xA3\xBF");
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 3);
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 6);

  /* Simply illegal. */
  p = b;
  snprintf(b, sizeof(b), "\xF8\xF9\xFA\xFB\xFC\xFD\xFE\xFF");

  for (i = 1; i <= 8; i++) {
    ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
    ASSERT(p == b + i);
  }

  return 0;
}